

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  U32 UVar2;
  ZSTD_optimal_t *pZVar3;
  ZSTD_match_t *pZVar4;
  BYTE *pBVar5;
  ZSTD_optimal_t sol;
  ZSTD_optimal_t sol_00;
  ZSTD_optimal_t sol_01;
  ZSTD_optimal_t sol_02;
  ZSTD_optimal_t sol_03;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  U32 UVar24;
  U32 UVar25;
  U32 UVar26;
  U32 UVar27;
  U32 UVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  U32 UVar32;
  uint uVar33;
  optState_t *optPtr;
  BYTE *iend_00;
  U32 *pUVar34;
  BYTE *pBVar35;
  size_t sVar36;
  ZSTD_optimal_t *pZVar37;
  ZSTD_optimal_t *pZVar38;
  bool bVar39;
  repcodes_t rVar40;
  undefined8 in_stack_ffffffffffffe994;
  U32 local_1660;
  uint local_165c;
  U32 local_1654;
  uint local_162c;
  U32 local_1624;
  BYTE *local_1620;
  BYTE *local_1610;
  BYTE *local_15f8;
  U32 local_15e8;
  U32 local_15e4;
  uint local_15e0;
  U32 local_15dc;
  U32 local_15d8;
  U32 local_15d4;
  U32 local_15d0;
  U32 local_15cc;
  BYTE *local_15c8;
  BYTE *local_15c0;
  ZSTD_compressionParameters *local_15b8;
  ZSTD_matchState_t *local_15b0;
  U32 local_15a4;
  U32 local_15a0;
  uint local_159c;
  BYTE *local_1598;
  BYTE *local_1588;
  BYTE *local_1570;
  U32 local_1560;
  U32 local_155c;
  uint local_1558;
  U32 local_1554;
  U32 local_1550;
  U32 local_154c;
  U32 local_1548;
  U32 local_1544;
  BYTE *local_1540;
  BYTE *local_1538;
  ZSTD_compressionParameters *local_1530;
  ZSTD_matchState_t *local_1528;
  U32 local_151c;
  U32 local_1518;
  uint local_1514;
  BYTE *local_1510;
  BYTE *local_1500;
  BYTE *local_14e8;
  U32 local_14d8;
  U32 local_14d4;
  uint local_14d0;
  U32 local_14cc;
  U32 local_14c8;
  U32 local_14c4;
  U32 local_14c0;
  U32 local_14bc;
  BYTE *local_14b8;
  BYTE *local_14b0;
  ZSTD_compressionParameters *local_14a8;
  ZSTD_matchState_t *local_14a0;
  U32 local_1494;
  U32 local_1490;
  uint local_148c;
  BYTE *local_1488;
  BYTE *local_1478;
  BYTE *local_1460;
  U32 local_1450;
  U32 local_144c;
  uint local_1448;
  U32 local_1444;
  U32 local_1440;
  U32 local_143c;
  U32 local_1438;
  U32 local_1434;
  BYTE *local_1430;
  BYTE *local_1428;
  ZSTD_compressionParameters *local_1420;
  ZSTD_matchState_t *local_1418;
  U32 local_140c;
  U32 local_1408;
  uint local_1404;
  U32 local_13f4;
  U32 local_13e4;
  BYTE *local_13c0;
  BYTE *local_13b0;
  BYTE *local_1398;
  U32 local_1388;
  U32 local_1384;
  uint local_1380;
  U32 local_137c;
  U32 local_1378;
  U32 local_1374;
  U32 local_1370;
  U32 local_136c;
  BYTE *local_1368;
  BYTE *local_1360;
  ZSTD_compressionParameters *local_1358;
  ZSTD_matchState_t *local_1350;
  U32 local_1344;
  U32 local_1340;
  uint local_133c;
  BYTE *local_1338;
  BYTE *local_1328;
  BYTE *local_1310;
  U32 local_1300;
  U32 local_12fc;
  uint local_12f8;
  U32 local_12f4;
  U32 local_12f0;
  U32 local_12ec;
  U32 local_12e8;
  U32 local_12e4;
  BYTE *local_12e0;
  BYTE *local_12d8;
  ZSTD_compressionParameters *local_12d0;
  ZSTD_matchState_t *local_12c8;
  U32 local_12bc;
  U32 local_12b8;
  uint local_12b4;
  BYTE *local_12b0;
  BYTE *local_12a0;
  BYTE *local_1288;
  U32 local_1278;
  U32 local_1274;
  uint local_1270;
  U32 local_126c;
  U32 local_1268;
  U32 local_1264;
  U32 local_1260;
  U32 local_125c;
  BYTE *local_1258;
  BYTE *local_1250;
  ZSTD_compressionParameters *local_1248;
  ZSTD_matchState_t *local_1240;
  U32 local_1234;
  U32 local_1230;
  uint local_122c;
  BYTE *local_1228;
  BYTE *local_1218;
  BYTE *local_1200;
  uint local_11f0;
  uint local_11ec;
  uint local_11e8;
  uint local_11dc;
  uint local_11d8;
  uint local_11d4;
  BYTE *local_11d0;
  BYTE *local_11c8;
  ZSTD_matchState_t *local_11b8;
  U32 local_11ac;
  U32 local_11a8;
  uint local_11a4;
  uint local_1198;
  U32 current;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 currentOffset;
  U32 repCode_8;
  U32 advance;
  U32 offCode_2;
  U32 mlen_9;
  U32 llen;
  U32 storePos;
  uint local_1128;
  U32 backDist;
  U32 seqPos;
  U32 storeStart;
  U32 storeEnd;
  int price_2;
  U32 pos_1;
  U32 mlen_8;
  U32 startML;
  U32 lastML;
  U32 local_1100;
  repcodes_t repHistory_1;
  U32 offset_1;
  U32 maxML_1;
  U32 matchNb_1;
  U32 nbMatches_1;
  U32 basePrice;
  U32 previousPrice;
  U32 litlen_2;
  U32 ll0_1;
  int price_1;
  U32 litlen_1;
  BYTE *inr;
  U32 sequencePrice;
  U32 matchPrice;
  U32 local_10a8;
  repcodes_t repHistory;
  U32 end;
  U32 offset;
  U32 matchNb;
  U32 pos;
  U32 literalsPrice;
  U32 maxOffset;
  U32 maxML;
  U32 i;
  U32 nbMatches;
  U32 ll0;
  U32 litlen;
  U32 last_pos;
  U32 cur;
  ZSTD_optimal_t lastSequence;
  ZSTD_match_t *matches;
  ZSTD_optimal_t *opt;
  U32 minMatch;
  U32 sufficient_len;
  ZSTD_compressionParameters *cParams;
  BYTE *prefixStart;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  optState_t *optStatePtr;
  U32 matchLengthSearch_1;
  ZSTD_compressionParameters *cParams_6;
  uint local_f5c;
  uint local_f58;
  U32 idx_1;
  U32 target_1;
  BYTE *base_6;
  U32 matchLengthSearch;
  ZSTD_compressionParameters *cParams_1;
  uint local_ed4;
  uint local_ed0;
  U32 idx;
  U32 target;
  BYTE *base_1;
  U32 mlCode;
  U32 mlBase;
  U32 offCode;
  U32 price;
  int local_e78;
  U32 mlCode_1;
  U32 mlBase_1;
  U32 offCode_1;
  U32 price_3;
  int local_e4c;
  BYTE *local_e48;
  BYTE *match_3;
  size_t matchLength_1;
  U32 *nextPtr_1;
  U32 *dmsBt;
  U32 dictMatchIndex;
  size_t dmsH;
  BYTE *match_2;
  size_t matchLength;
  U32 *nextPtr;
  BYTE *match_1;
  BYTE *match;
  size_t mlen;
  U32 matchIndex3;
  BYTE *repMatch;
  U32 repLen;
  U32 repIndex;
  U32 repOffset;
  U32 repCode;
  U32 lastR;
  size_t bestLength;
  U32 dmsBtLow;
  U32 dmsBtMask;
  U32 dmsBtLog;
  U32 dmsHashLog;
  U32 dmsIndexDelta;
  U32 dmsLowLimit;
  U32 dmsHighLimit;
  BYTE *dmsEnd;
  BYTE *dmsBase;
  ZSTD_compressionParameters *dmsCParams;
  ZSTD_matchState_t *dms;
  U32 nbCompares;
  U32 mnum;
  U32 dummy32;
  U32 matchEndIdx;
  U32 *largerPtr;
  U32 *smallerPtr;
  U32 local_d50;
  U32 matchLow;
  U32 windowLow;
  U32 btLow;
  BYTE *prefixStart_1;
  BYTE *dictEnd;
  BYTE *pBStack_d30;
  U32 dictLimit;
  BYTE *dictBase;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  size_t sStack_d00;
  U32 matchIndex;
  size_t h;
  U32 *hashTable;
  U32 local_ce8;
  U32 minMatch_1;
  U32 hashLog;
  U32 current_1;
  BYTE *base_2;
  ZSTD_compressionParameters *pZStack_cd0;
  U32 sufficient_len_1;
  ZSTD_compressionParameters *cParams_2;
  ZSTD_match_t *local_cc0;
  uint local_cb4;
  U32 *local_cb0;
  int local_ca4;
  BYTE *local_ca0;
  BYTE *local_c98;
  ZSTD_matchState_t *local_c90;
  uint local_c84;
  BYTE *local_c80;
  BYTE *match_7;
  size_t matchLength_3;
  U32 *nextPtr_3;
  U32 *dmsBt_1;
  size_t sStack_c58;
  U32 dictMatchIndex_1;
  size_t dmsH_1;
  BYTE *match_6;
  size_t matchLength_2;
  U32 *nextPtr_2;
  BYTE *match_5;
  BYTE *match_4;
  size_t mlen_1;
  BYTE *pBStack_c18;
  U32 matchIndex3_1;
  BYTE *repMatch_1;
  uint local_c08;
  U32 repLen_1;
  U32 repIndex_1;
  U32 repOffset_1;
  U32 repCode_1;
  U32 lastR_1;
  size_t bestLength_1;
  uint local_be8;
  U32 dmsBtLow_1;
  U32 dmsBtMask_1;
  U32 dmsBtLog_1;
  U32 dmsHashLog_1;
  U32 dmsIndexDelta_1;
  U32 dmsLowLimit_1;
  U32 dmsHighLimit_1;
  BYTE *dmsEnd_1;
  BYTE *dmsBase_1;
  ZSTD_compressionParameters *dmsCParams_1;
  ZSTD_matchState_t *dms_1;
  U32 nbCompares_1;
  U32 mnum_1;
  U32 dummy32_1;
  U32 matchEndIdx_1;
  U32 *largerPtr_1;
  U32 *smallerPtr_1;
  U32 local_b88;
  U32 matchLow_1;
  U32 windowLow_1;
  U32 btLow_1;
  BYTE *prefixStart_2;
  BYTE *dictEnd_1;
  BYTE *pBStack_b68;
  U32 dictLimit_1;
  BYTE *dictBase_1;
  size_t commonLengthLarger_1;
  size_t commonLengthSmaller_1;
  U32 btMask_1;
  U32 btLog_1;
  U32 *bt_1;
  size_t sStack_b38;
  U32 matchIndex_1;
  size_t h_1;
  U32 *hashTable_1;
  U32 local_b20;
  U32 minMatch_2;
  U32 hashLog_1;
  U32 current_2;
  BYTE *base_3;
  ZSTD_compressionParameters *pZStack_b08;
  U32 sufficient_len_2;
  ZSTD_compressionParameters *cParams_3;
  ZSTD_match_t *local_af8;
  uint local_aec;
  U32 *local_ae8;
  int local_adc;
  BYTE *local_ad8;
  BYTE *local_ad0;
  ZSTD_matchState_t *local_ac8;
  uint local_abc;
  BYTE *local_ab8;
  BYTE *match_11;
  size_t matchLength_5;
  U32 *nextPtr_5;
  U32 *dmsBt_2;
  size_t sStack_a90;
  U32 dictMatchIndex_2;
  size_t dmsH_2;
  BYTE *match_10;
  size_t matchLength_4;
  U32 *nextPtr_4;
  BYTE *match_9;
  BYTE *match_8;
  size_t mlen_2;
  BYTE *pBStack_a50;
  U32 matchIndex3_2;
  BYTE *repMatch_2;
  uint local_a40;
  U32 repLen_2;
  U32 repIndex_2;
  U32 repOffset_2;
  U32 repCode_2;
  U32 lastR_2;
  size_t bestLength_2;
  uint local_a20;
  U32 dmsBtLow_2;
  U32 dmsBtMask_2;
  U32 dmsBtLog_2;
  U32 dmsHashLog_2;
  U32 dmsIndexDelta_2;
  U32 dmsLowLimit_2;
  U32 dmsHighLimit_2;
  BYTE *dmsEnd_2;
  BYTE *dmsBase_2;
  ZSTD_compressionParameters *dmsCParams_2;
  ZSTD_matchState_t *dms_2;
  U32 nbCompares_2;
  U32 mnum_2;
  U32 dummy32_2;
  U32 matchEndIdx_2;
  U32 *largerPtr_2;
  U32 *smallerPtr_2;
  U32 local_9c0;
  U32 matchLow_2;
  U32 windowLow_2;
  U32 btLow_2;
  BYTE *prefixStart_3;
  BYTE *dictEnd_2;
  BYTE *pBStack_9a0;
  U32 dictLimit_2;
  BYTE *dictBase_2;
  size_t commonLengthLarger_2;
  size_t commonLengthSmaller_2;
  U32 btMask_2;
  U32 btLog_2;
  U32 *bt_2;
  size_t sStack_970;
  U32 matchIndex_2;
  size_t h_2;
  U32 *hashTable_2;
  U32 local_958;
  U32 minMatch_3;
  U32 hashLog_2;
  U32 current_3;
  BYTE *base_4;
  ZSTD_compressionParameters *pZStack_940;
  U32 sufficient_len_3;
  ZSTD_compressionParameters *cParams_4;
  ZSTD_match_t *local_930;
  uint local_924;
  U32 *local_920;
  int local_914;
  BYTE *local_910;
  BYTE *local_908;
  ZSTD_matchState_t *local_900;
  uint local_8f4;
  BYTE *local_8f0;
  BYTE *match_15;
  size_t matchLength_7;
  U32 *nextPtr_7;
  U32 *dmsBt_3;
  size_t sStack_8c8;
  U32 dictMatchIndex_3;
  size_t dmsH_3;
  BYTE *match_14;
  size_t matchLength_6;
  U32 *nextPtr_6;
  BYTE *match_13;
  BYTE *match_12;
  size_t mlen_3;
  BYTE *pBStack_888;
  U32 matchIndex3_3;
  BYTE *repMatch_3;
  uint local_878;
  U32 repLen_3;
  U32 repIndex_3;
  U32 repOffset_3;
  U32 repCode_3;
  U32 lastR_3;
  size_t bestLength_3;
  uint local_858;
  U32 dmsBtLow_3;
  U32 dmsBtMask_3;
  U32 dmsBtLog_3;
  U32 dmsHashLog_3;
  U32 dmsIndexDelta_3;
  U32 dmsLowLimit_3;
  U32 dmsHighLimit_3;
  BYTE *dmsEnd_3;
  BYTE *dmsBase_3;
  ZSTD_compressionParameters *dmsCParams_3;
  ZSTD_matchState_t *dms_3;
  U32 nbCompares_3;
  U32 mnum_3;
  U32 dummy32_3;
  U32 matchEndIdx_3;
  U32 *largerPtr_3;
  U32 *smallerPtr_3;
  U32 local_7f8;
  U32 matchLow_3;
  U32 windowLow_3;
  U32 btLow_3;
  BYTE *prefixStart_4;
  BYTE *dictEnd_3;
  BYTE *pBStack_7d8;
  U32 dictLimit_3;
  BYTE *dictBase_3;
  size_t commonLengthLarger_3;
  size_t commonLengthSmaller_3;
  U32 btMask_3;
  U32 btLog_3;
  U32 *bt_3;
  size_t sStack_7a8;
  U32 matchIndex_3;
  size_t h_3;
  U32 *hashTable_3;
  U32 local_790;
  U32 minMatch_4;
  U32 hashLog_3;
  U32 current_4;
  BYTE *base_5;
  ZSTD_compressionParameters *pZStack_778;
  U32 sufficient_len_4;
  ZSTD_compressionParameters *cParams_5;
  ZSTD_match_t *local_768;
  uint local_75c;
  U32 *local_758;
  int local_74c;
  BYTE *local_748;
  BYTE *local_740;
  ZSTD_matchState_t *local_738;
  uint local_72c;
  BYTE *local_728;
  BYTE *match_19;
  size_t matchLength_9;
  U32 *nextPtr_9;
  U32 *dmsBt_4;
  size_t sStack_700;
  U32 dictMatchIndex_4;
  size_t dmsH_4;
  BYTE *match_18;
  size_t matchLength_8;
  U32 *nextPtr_8;
  BYTE *match_17;
  BYTE *match_16;
  size_t mlen_4;
  BYTE *pBStack_6c0;
  U32 matchIndex3_4;
  BYTE *repMatch_4;
  uint local_6b0;
  U32 repLen_4;
  U32 repIndex_4;
  U32 repOffset_4;
  U32 repCode_4;
  U32 lastR_4;
  size_t bestLength_4;
  uint local_690;
  U32 dmsBtLow_4;
  U32 dmsBtMask_4;
  U32 dmsBtLog_4;
  U32 dmsHashLog_4;
  U32 dmsIndexDelta_4;
  U32 dmsLowLimit_4;
  U32 dmsHighLimit_4;
  BYTE *dmsEnd_4;
  BYTE *dmsBase_4;
  ZSTD_compressionParameters *dmsCParams_4;
  ZSTD_matchState_t *dms_4;
  U32 nbCompares_4;
  U32 mnum_4;
  U32 dummy32_4;
  U32 matchEndIdx_4;
  U32 *largerPtr_4;
  U32 *smallerPtr_4;
  U32 local_630;
  U32 matchLow_4;
  U32 windowLow_4;
  U32 btLow_4;
  BYTE *prefixStart_5;
  BYTE *dictEnd_4;
  BYTE *pBStack_610;
  U32 dictLimit_4;
  BYTE *dictBase_4;
  size_t commonLengthLarger_4;
  size_t commonLengthSmaller_4;
  U32 btMask_4;
  U32 btLog_4;
  U32 *bt_4;
  size_t sStack_5e0;
  U32 matchIndex_4;
  size_t h_4;
  U32 *hashTable_4;
  U32 local_5c8;
  U32 minMatch_5;
  U32 hashLog_4;
  U32 current_5;
  BYTE *base_7;
  ZSTD_compressionParameters *pZStack_5b0;
  U32 sufficient_len_5;
  ZSTD_compressionParameters *cParams_7;
  ZSTD_match_t *local_5a0;
  uint local_594;
  U32 *local_590;
  int local_584;
  BYTE *local_580;
  BYTE *local_578;
  ZSTD_matchState_t *local_570;
  uint local_564;
  BYTE *local_560;
  BYTE *match_23;
  size_t matchLength_11;
  U32 *nextPtr_11;
  U32 *dmsBt_5;
  size_t sStack_538;
  U32 dictMatchIndex_5;
  size_t dmsH_5;
  BYTE *match_22;
  size_t matchLength_10;
  U32 *nextPtr_10;
  BYTE *match_21;
  BYTE *match_20;
  size_t mlen_5;
  BYTE *pBStack_4f8;
  U32 matchIndex3_5;
  BYTE *repMatch_5;
  uint local_4e8;
  U32 repLen_5;
  U32 repIndex_5;
  U32 repOffset_5;
  U32 repCode_5;
  U32 lastR_5;
  size_t bestLength_5;
  uint local_4c8;
  U32 dmsBtLow_5;
  U32 dmsBtMask_5;
  U32 dmsBtLog_5;
  U32 dmsHashLog_5;
  U32 dmsIndexDelta_5;
  U32 dmsLowLimit_5;
  U32 dmsHighLimit_5;
  BYTE *dmsEnd_5;
  BYTE *dmsBase_5;
  ZSTD_compressionParameters *dmsCParams_5;
  ZSTD_matchState_t *dms_5;
  U32 nbCompares_5;
  U32 mnum_5;
  U32 dummy32_5;
  U32 matchEndIdx_5;
  U32 *largerPtr_5;
  U32 *smallerPtr_5;
  U32 local_468;
  U32 matchLow_5;
  U32 windowLow_5;
  U32 btLow_5;
  BYTE *prefixStart_6;
  BYTE *dictEnd_5;
  BYTE *pBStack_448;
  U32 dictLimit_5;
  BYTE *dictBase_5;
  size_t commonLengthLarger_5;
  size_t commonLengthSmaller_5;
  U32 btMask_5;
  U32 btLog_5;
  U32 *bt_5;
  size_t sStack_418;
  U32 matchIndex_5;
  size_t h_5;
  U32 *hashTable_5;
  U32 local_400;
  U32 minMatch_6;
  U32 hashLog_5;
  U32 current_6;
  BYTE *base_8;
  ZSTD_compressionParameters *pZStack_3e8;
  U32 sufficient_len_6;
  ZSTD_compressionParameters *cParams_8;
  ZSTD_match_t *local_3d8;
  uint local_3cc;
  U32 *local_3c8;
  int local_3bc;
  BYTE *local_3b8;
  BYTE *local_3b0;
  ZSTD_matchState_t *local_3a8;
  uint local_39c;
  BYTE *local_398;
  BYTE *match_27;
  size_t matchLength_13;
  U32 *nextPtr_13;
  U32 *dmsBt_6;
  size_t sStack_370;
  U32 dictMatchIndex_6;
  size_t dmsH_6;
  BYTE *match_26;
  size_t matchLength_12;
  U32 *nextPtr_12;
  BYTE *match_25;
  BYTE *match_24;
  size_t mlen_6;
  BYTE *pBStack_330;
  U32 matchIndex3_6;
  BYTE *repMatch_6;
  uint local_320;
  U32 repLen_6;
  U32 repIndex_6;
  U32 repOffset_6;
  U32 repCode_6;
  U32 lastR_6;
  size_t bestLength_6;
  uint local_300;
  U32 dmsBtLow_6;
  U32 dmsBtMask_6;
  U32 dmsBtLog_6;
  U32 dmsHashLog_6;
  U32 dmsIndexDelta_6;
  U32 dmsLowLimit_6;
  U32 dmsHighLimit_6;
  BYTE *dmsEnd_6;
  BYTE *dmsBase_6;
  ZSTD_compressionParameters *dmsCParams_6;
  ZSTD_matchState_t *dms_6;
  U32 nbCompares_6;
  U32 mnum_6;
  U32 dummy32_6;
  U32 matchEndIdx_6;
  U32 *largerPtr_6;
  U32 *smallerPtr_6;
  U32 local_2a0;
  U32 matchLow_6;
  U32 windowLow_6;
  U32 btLow_6;
  BYTE *prefixStart_7;
  BYTE *dictEnd_6;
  BYTE *pBStack_280;
  U32 dictLimit_6;
  BYTE *dictBase_6;
  size_t commonLengthLarger_6;
  size_t commonLengthSmaller_6;
  U32 btMask_6;
  U32 btLog_6;
  U32 *bt_6;
  size_t sStack_250;
  U32 matchIndex_6;
  size_t h_6;
  U32 *hashTable_6;
  U32 local_238;
  U32 minMatch_7;
  U32 hashLog_6;
  U32 current_7;
  BYTE *base_9;
  ZSTD_compressionParameters *pZStack_220;
  U32 sufficient_len_7;
  ZSTD_compressionParameters *cParams_9;
  ZSTD_match_t *local_210;
  uint local_204;
  U32 *local_200;
  int local_1f4;
  BYTE *local_1f0;
  BYTE *local_1e8;
  ZSTD_matchState_t *local_1e0;
  uint local_1d4;
  BYTE *local_1d0;
  BYTE *match_31;
  size_t matchLength_15;
  U32 *nextPtr_15;
  U32 *dmsBt_7;
  size_t sStack_1a8;
  U32 dictMatchIndex_7;
  size_t dmsH_7;
  BYTE *match_30;
  size_t matchLength_14;
  U32 *nextPtr_14;
  BYTE *match_29;
  BYTE *match_28;
  size_t mlen_7;
  BYTE *pBStack_168;
  U32 matchIndex3_7;
  BYTE *repMatch_7;
  uint local_158;
  U32 repLen_7;
  U32 repIndex_7;
  U32 repOffset_7;
  U32 repCode_7;
  U32 lastR_7;
  size_t bestLength_7;
  uint local_138;
  U32 dmsBtLow_7;
  U32 dmsBtMask_7;
  U32 dmsBtLog_7;
  U32 dmsHashLog_7;
  U32 dmsIndexDelta_7;
  U32 dmsLowLimit_7;
  U32 dmsHighLimit_7;
  BYTE *dmsEnd_7;
  BYTE *dmsBase_7;
  ZSTD_compressionParameters *dmsCParams_7;
  ZSTD_matchState_t *dms_7;
  U32 nbCompares_7;
  U32 mnum_7;
  U32 dummy32_7;
  U32 matchEndIdx_7;
  U32 *largerPtr_7;
  U32 *smallerPtr_7;
  U32 local_d8;
  U32 matchLow_7;
  U32 windowLow_7;
  U32 btLow_7;
  BYTE *prefixStart_8;
  BYTE *dictEnd_7;
  BYTE *pBStack_b8;
  U32 dictLimit_7;
  BYTE *dictBase_7;
  size_t commonLengthLarger_7;
  size_t commonLengthSmaller_7;
  U32 btMask_7;
  U32 btLog_7;
  U32 *bt_7;
  size_t sStack_88;
  U32 matchIndex_7;
  size_t h_7;
  U32 *hashTable_7;
  U32 local_70;
  U32 minMatch_8;
  U32 hashLog_7;
  U32 current_8;
  BYTE *base_10;
  ZSTD_compressionParameters *pZStack_58;
  U32 sufficient_len_8;
  ZSTD_compressionParameters *cParams_10;
  ZSTD_match_t *local_48;
  uint local_3c;
  U32 *local_38;
  int local_2c;
  BYTE *local_28;
  BYTE *local_20;
  ZSTD_matchState_t *local_18;
  uint local_c;
  
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      ((ms->window).dictLimit == (ms->window).lowLimit)) &&
     (((int)src - (int)(ms->window).base == (ms->window).dictLimit && (0x400 < srcSize)))) {
    ZSTD_initStats_ultra(ms,seqStore,rep,src,srcSize);
  }
  optPtr = &ms->opt;
  iend_00 = (BYTE *)((long)src + srcSize);
  pBVar35 = (ms->window).base;
  uVar31 = (ms->window).dictLimit;
  if ((ms->cParams).targetLength < 0xfff) {
    local_1198 = (ms->cParams).targetLength;
  }
  else {
    local_1198 = 0xfff;
  }
  uVar21 = 4;
  if ((ms->cParams).minMatch == 3) {
    uVar21 = 3;
  }
  pZVar3 = (ms->opt).priceTable;
  pZVar4 = (ms->opt).matchTable;
  ms->nextToUpdate3 = ms->nextToUpdate;
  ZSTD_rescaleFreqs(optPtr,(BYTE *)src,srcSize,2);
  anchor = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar35 + uVar31));
  iend = (BYTE *)src;
  do {
    if (iend_00 + -8 <= anchor) {
      return (long)iend_00 - (long)iend;
    }
    iVar23 = (int)anchor;
    lastSequence.off = iVar23 - (int)iend;
    uVar31 = (uint)((lastSequence.off != 0 ^ 0xffU) & 1);
    UVar24 = (ms->cParams).minMatch;
    if (anchor < (ms->window).base + ms->nextToUpdate) {
      local_ed4 = 0;
    }
    else {
      pBVar35 = (ms->window).base;
      uVar30 = iVar23 - (int)pBVar35;
      for (local_ed0 = ms->nextToUpdate; local_ed0 < uVar30; local_ed0 = UVar32 + local_ed0) {
        UVar32 = ZSTD_insertBt1(ms,pBVar35 + local_ed0,iend_00,UVar24,0);
      }
      ms->nextToUpdate = uVar30;
      switch(UVar24) {
      case 3:
        local_c98 = anchor;
        local_ca4 = 0;
        cParams_2._0_4_ = 3;
        pZStack_cd0 = &ms->cParams;
        if ((ms->cParams).targetLength < 0xfff) {
          local_11a4 = (ms->cParams).targetLength;
        }
        else {
          local_11a4 = 0xfff;
        }
        base_2._4_4_ = local_11a4;
        _hashLog = (ms->window).base;
        minMatch_1 = iVar23 - (int)_hashLog;
        local_ce8 = (ms->cParams).hashLog;
        hashTable._4_4_ = 3;
        h = (size_t)ms->hashTable;
        cParams_2._4_4_ = uVar21;
        local_cc0 = pZVar4;
        local_cb4 = uVar31;
        local_cb0 = rep;
        local_ca0 = iend_00;
        local_c90 = ms;
        sStack_d00 = ZSTD_hashPtr(anchor,local_ce8,3);
        bt._4_4_ = *(uint *)(h + sStack_d00 * 4);
        _btMask = local_c90->chainTable;
        commonLengthSmaller._4_4_ = pZStack_cd0->chainLog - 1;
        commonLengthSmaller._0_4_ = (1 << ((byte)commonLengthSmaller._4_4_ & 0x1f)) - 1;
        commonLengthLarger = 0;
        dictBase = (BYTE *)0x0;
        pBStack_d30 = (local_c90->window).dictBase;
        dictEnd._4_4_ = (local_c90->window).dictLimit;
        prefixStart_1 = pBStack_d30 + dictEnd._4_4_;
        _windowLow = _hashLog + dictEnd._4_4_;
        if ((uint)commonLengthSmaller < minMatch_1) {
          local_11a8 = minMatch_1 - (uint)commonLengthSmaller;
        }
        else {
          local_11a8 = 0;
        }
        matchLow = local_11a8;
        local_d50 = (local_c90->window).lowLimit;
        local_11ac = local_d50;
        if (local_d50 == 0) {
          local_11ac = 1;
        }
        smallerPtr._4_4_ = local_11ac;
        largerPtr = _btMask + ((minMatch_1 & (uint)commonLengthSmaller) << 1);
        _dummy32 = _btMask + (ulong)((minMatch_1 & (uint)commonLengthSmaller) << 1) + 1;
        mnum = minMatch_1 + 9;
        dms._4_4_ = 0;
        uVar30 = pZStack_cd0->searchLog;
        if (local_ca4 == 2) {
          local_11b8 = local_c90->dictMatchState;
          local_11c8 = (local_11b8->window).base;
          local_11d0 = (local_11b8->window).nextSrc;
          local_11d4 = (int)local_11d0 - (int)local_11c8;
          local_11d8 = (local_11b8->window).lowLimit;
          local_11dc = local_d50 - local_11d4;
          UVar24 = (local_11b8->cParams).hashLog;
          local_11e8 = (1 << ((char)(local_11b8->cParams).chainLog - 1U & 0x1f)) - 1;
          local_11ec = local_11d8;
          if (local_11e8 < local_11d4 - local_11d8) {
            local_11ec = local_11d4 - local_11e8;
          }
        }
        else {
          local_11b8 = (ZSTD_matchState_t *)0x0;
          local_11c8 = (BYTE *)0x0;
          local_11d0 = (BYTE *)0x0;
          local_11d4 = 0;
          local_11d8 = 0;
          local_11dc = 0;
          local_11e8 = 0;
          local_11ec = local_11d8;
          UVar24 = local_ce8;
        }
        _repCode = (BYTE *)(ulong)(cParams_2._4_4_ - 1);
        uVar22 = local_cb4 + 3;
        for (repIndex = local_cb4; repIndex < uVar22; repIndex = repIndex + 1) {
          if (repIndex == 3) {
            local_11f0 = *local_cb0 - 1;
          }
          else {
            local_11f0 = local_cb0[repIndex];
          }
          uVar33 = minMatch_1 - local_11f0;
          repMatch._4_4_ = 0;
          if (local_11f0 - 1 < minMatch_1 - dictEnd._4_4_) {
            UVar32 = ZSTD_readMINMATCH(local_c98,hashTable._4_4_);
            UVar25 = ZSTD_readMINMATCH(local_c98 + -(ulong)local_11f0,hashTable._4_4_);
            if (UVar32 == UVar25) {
              sVar36 = ZSTD_count(local_c98 + hashTable._4_4_,
                                  local_c98 + ((ulong)hashTable._4_4_ - (ulong)local_11f0),local_ca0
                                 );
              repMatch._4_4_ = (int)sVar36 + hashTable._4_4_;
            }
          }
          else {
            if (local_ca4 == 2) {
              local_1200 = local_11c8 + ((ulong)uVar33 - (ulong)local_11dc);
            }
            else {
              local_1200 = pBStack_d30 + uVar33;
            }
            if ((local_ca4 == 1) &&
               (local_11f0 - 1 < minMatch_1 - local_d50 && 2 < (dictEnd._4_4_ - 1) - uVar33)) {
              UVar32 = ZSTD_readMINMATCH(local_c98,hashTable._4_4_);
              UVar25 = ZSTD_readMINMATCH(local_1200,hashTable._4_4_);
              if (UVar32 == UVar25) {
                sVar36 = ZSTD_count_2segments
                                   (local_c98 + hashTable._4_4_,local_1200 + hashTable._4_4_,
                                    local_ca0,prefixStart_1,_windowLow);
                repMatch._4_4_ = (int)sVar36 + hashTable._4_4_;
              }
            }
            if ((local_ca4 == 2) &&
               (local_11f0 - 1 < minMatch_1 - (local_11d8 + local_11dc) &&
                2 < (dictEnd._4_4_ - 1) - uVar33)) {
              UVar32 = ZSTD_readMINMATCH(local_c98,hashTable._4_4_);
              UVar25 = ZSTD_readMINMATCH(local_1200,hashTable._4_4_);
              if (UVar32 == UVar25) {
                sVar36 = ZSTD_count_2segments
                                   (local_c98 + hashTable._4_4_,local_1200 + hashTable._4_4_,
                                    local_ca0,local_11d0,_windowLow);
                repMatch._4_4_ = (int)sVar36 + hashTable._4_4_;
              }
            }
          }
          if (_repCode < (BYTE *)(ulong)repMatch._4_4_) {
            _repCode = (BYTE *)(ulong)repMatch._4_4_;
            local_cc0[dms._4_4_].off = repIndex - local_cb4;
            local_cc0[dms._4_4_].len = repMatch._4_4_;
            dms._4_4_ = dms._4_4_ + 1;
            uVar33 = dms._4_4_;
            if (base_2._4_4_ < repMatch._4_4_ || local_c98 + repMatch._4_4_ == local_ca0)
            goto LAB_00135c88;
          }
        }
        if ((((uint)cParams_2 == 3) && (_repCode < (BYTE *)0x3)) &&
           (UVar32 = ZSTD_insertAndFindFirstIndexHash3(local_c90,local_c98),
           smallerPtr._4_4_ <= UVar32 && minMatch_1 - UVar32 < 0x40000)) {
          if (((local_ca4 == 0) || (local_ca4 == 2)) || (dictEnd._4_4_ <= UVar32)) {
            match = (BYTE *)ZSTD_count(local_c98,_hashLog + UVar32,local_ca0);
          }
          else {
            match = (BYTE *)ZSTD_count_2segments
                                      (local_c98,pBStack_d30 + UVar32,local_ca0,prefixStart_1,
                                       _windowLow);
          }
          if (match < (BYTE *)(ulong)(uint)cParams_2) goto LAB_001355a6;
          _repCode = match;
          local_cc0->off = (minMatch_1 - UVar32) + 2;
          local_cc0->len = (U32)match;
          dms._4_4_ = 1;
          if (match <= (BYTE *)(ulong)base_2._4_4_ && local_c98 + (long)match != local_ca0)
          goto LAB_001355a6;
          local_c90->nextToUpdate = minMatch_1 + 1;
          local_c84 = 1;
          uVar33 = local_c84;
        }
        else {
LAB_001355a6:
          *(U32 *)(h + sStack_d00 * 4) = minMatch_1;
          dms._0_4_ = 1 << ((byte)uVar30 & 0x1f);
          while (iVar23 = (int)dms + -1, bVar39 = (int)dms != 0, dms._0_4_ = iVar23,
                bVar39 && smallerPtr._4_4_ <= bt._4_4_) {
            pUVar34 = _btMask + ((bt._4_4_ & (uint)commonLengthSmaller) << 1);
            if (commonLengthLarger < dictBase) {
              local_1218 = (BYTE *)commonLengthLarger;
            }
            else {
              local_1218 = dictBase;
            }
            if (((local_ca4 == 0) || (local_ca4 == 2)) ||
               ((BYTE *)(ulong)dictEnd._4_4_ <= local_1218 + bt._4_4_)) {
              dmsH = (size_t)(_hashLog + bt._4_4_);
              sVar36 = ZSTD_count(local_c98 + (long)local_1218,(BYTE *)(dmsH + (long)local_1218),
                                  local_ca0);
              match_2 = local_1218 + sVar36;
            }
            else {
              dmsH = (size_t)(pBStack_d30 + bt._4_4_);
              sVar36 = ZSTD_count_2segments
                                 (local_c98 + (long)local_1218,(BYTE *)(dmsH + (long)local_1218),
                                  local_ca0,prefixStart_1,_windowLow);
              match_2 = local_1218 + sVar36;
              if ((BYTE *)(ulong)dictEnd._4_4_ <= match_2 + bt._4_4_) {
                dmsH = (size_t)(_hashLog + bt._4_4_);
              }
            }
            if (_repCode < match_2) {
              if ((BYTE *)(ulong)(mnum - bt._4_4_) < match_2) {
                mnum = bt._4_4_ + (U32)match_2;
              }
              _repCode = match_2;
              local_cc0[dms._4_4_].off = (minMatch_1 - bt._4_4_) + 2;
              local_cc0[dms._4_4_].len = (U32)match_2;
              dms._4_4_ = dms._4_4_ + 1;
              if ((BYTE *)0x1000 < match_2 || local_c98 + (long)match_2 == local_ca0) {
                if (local_ca4 == 2) {
                  dms._0_4_ = 0;
                }
                break;
              }
            }
            if (match_2[dmsH] < local_c98[(long)match_2]) {
              *largerPtr = bt._4_4_;
              commonLengthLarger = (size_t)match_2;
              if (bt._4_4_ <= matchLow) {
                largerPtr = &nbCompares;
                break;
              }
              largerPtr = pUVar34 + 1;
              bt._4_4_ = pUVar34[1];
            }
            else {
              *_dummy32 = bt._4_4_;
              dictBase = match_2;
              if (bt._4_4_ <= matchLow) {
                _dummy32 = &nbCompares;
                break;
              }
              bt._4_4_ = *pUVar34;
              _dummy32 = pUVar34;
            }
          }
          *_dummy32 = 0;
          *largerPtr = 0;
          if ((local_ca4 == 2) && ((int)dms != 0)) {
            sVar36 = ZSTD_hashPtr(local_c98,UVar24,(uint)cParams_2);
            dmsBt._4_4_ = local_11b8->hashTable[sVar36];
            pUVar34 = local_11b8->chainTable;
            dictBase = (BYTE *)0x0;
            commonLengthLarger = 0;
            while ((int)dms != 0 && local_11d8 < dmsBt._4_4_) {
              if (commonLengthLarger < dictBase) {
                local_1228 = (BYTE *)commonLengthLarger;
              }
              else {
                local_1228 = dictBase;
              }
              local_e48 = local_11c8 + dmsBt._4_4_;
              sVar36 = ZSTD_count_2segments
                                 (local_c98 + (long)local_1228,local_e48 + (long)local_1228,
                                  local_ca0,local_11d0,_windowLow);
              local_1228 = local_1228 + sVar36;
              if ((BYTE *)(ulong)local_11d4 <= local_1228 + dmsBt._4_4_) {
                local_e48 = _hashLog + (ulong)local_11dc + (ulong)dmsBt._4_4_;
              }
              if (_repCode < local_1228) {
                bt._4_4_ = dmsBt._4_4_ + local_11dc;
                if ((BYTE *)(ulong)(mnum - bt._4_4_) < local_1228) {
                  mnum = bt._4_4_ + (U32)local_1228;
                }
                local_cc0[dms._4_4_].off = (minMatch_1 - bt._4_4_) + 2;
                local_cc0[dms._4_4_].len = (U32)local_1228;
                dms._4_4_ = dms._4_4_ + 1;
                _repCode = local_1228;
                if ((BYTE *)0x1000 < local_1228 || local_c98 + (long)local_1228 == local_ca0) break;
              }
              if (dmsBt._4_4_ <= local_11ec) break;
              if (local_e48[(long)local_1228] < local_c98[(long)local_1228]) {
                dmsBt._4_4_ = (pUVar34 + ((dmsBt._4_4_ & local_11e8) << 1))[1];
                dms._0_4_ = (int)dms + -1;
                commonLengthLarger = (size_t)local_1228;
              }
              else {
                dmsBt._4_4_ = pUVar34[(dmsBt._4_4_ & local_11e8) << 1];
                dms._0_4_ = (int)dms + -1;
                dictBase = local_1228;
              }
            }
          }
          local_c90->nextToUpdate = mnum - 8;
          local_c84 = dms._4_4_;
          uVar33 = local_c84;
        }
LAB_00135c88:
        local_c84 = uVar33;
        local_ed4 = local_c84;
        break;
      default:
        local_ad0 = anchor;
        local_adc = 0;
        cParams_3._0_4_ = 4;
        pZStack_b08 = &ms->cParams;
        if ((ms->cParams).targetLength < 0xfff) {
          local_122c = (ms->cParams).targetLength;
        }
        else {
          local_122c = 0xfff;
        }
        base_3._4_4_ = local_122c;
        _hashLog_1 = (ms->window).base;
        minMatch_2 = iVar23 - (int)_hashLog_1;
        local_b20 = (ms->cParams).hashLog;
        hashTable_1._4_4_ = 4;
        h_1 = (size_t)ms->hashTable;
        cParams_3._4_4_ = uVar21;
        local_af8 = pZVar4;
        local_aec = uVar31;
        local_ae8 = rep;
        local_ad8 = iend_00;
        local_ac8 = ms;
        sStack_b38 = ZSTD_hashPtr(anchor,local_b20,4);
        bt_1._4_4_ = *(uint *)(h_1 + sStack_b38 * 4);
        _btMask_1 = local_ac8->chainTable;
        commonLengthSmaller_1._4_4_ = pZStack_b08->chainLog - 1;
        commonLengthSmaller_1._0_4_ = (1 << ((byte)commonLengthSmaller_1._4_4_ & 0x1f)) - 1;
        commonLengthLarger_1 = 0;
        dictBase_1 = (BYTE *)0x0;
        pBStack_b68 = (local_ac8->window).dictBase;
        dictEnd_1._4_4_ = (local_ac8->window).dictLimit;
        prefixStart_2 = pBStack_b68 + dictEnd_1._4_4_;
        _windowLow_1 = _hashLog_1 + dictEnd_1._4_4_;
        if ((uint)commonLengthSmaller_1 < minMatch_2) {
          local_1230 = minMatch_2 - (uint)commonLengthSmaller_1;
        }
        else {
          local_1230 = 0;
        }
        matchLow_1 = local_1230;
        local_b88 = (local_ac8->window).lowLimit;
        local_1234 = local_b88;
        if (local_b88 == 0) {
          local_1234 = 1;
        }
        smallerPtr_1._4_4_ = local_1234;
        largerPtr_1 = _btMask_1 + ((minMatch_2 & (uint)commonLengthSmaller_1) << 1);
        _dummy32_1 = _btMask_1 + (ulong)((minMatch_2 & (uint)commonLengthSmaller_1) << 1) + 1;
        mnum_1 = minMatch_2 + 9;
        dms_1._4_4_ = 0;
        dms_1._0_4_ = 1 << ((byte)pZStack_b08->searchLog & 0x1f);
        if (local_adc == 2) {
          local_1240 = local_ac8->dictMatchState;
        }
        else {
          local_1240 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams_1 = (ZSTD_compressionParameters *)local_1240;
        if (local_adc == 2) {
          local_1248 = &local_1240->cParams;
        }
        else {
          local_1248 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase_1 = (BYTE *)local_1248;
        if (local_adc == 2) {
          local_1250 = (local_1240->window).base;
        }
        else {
          local_1250 = (BYTE *)0x0;
        }
        dmsEnd_1 = local_1250;
        if (local_adc == 2) {
          local_1258 = (local_1240->window).nextSrc;
        }
        else {
          local_1258 = (BYTE *)0x0;
        }
        _dmsLowLimit_1 = local_1258;
        if (local_adc == 2) {
          local_125c = (int)local_1258 - (int)local_1250;
        }
        else {
          local_125c = 0;
        }
        dmsIndexDelta_1 = local_125c;
        if (local_adc == 2) {
          local_1260 = (local_1240->window).lowLimit;
        }
        else {
          local_1260 = 0;
        }
        dmsHashLog_1 = local_1260;
        if (local_adc == 2) {
          local_1264 = local_b88 - local_125c;
        }
        else {
          local_1264 = 0;
        }
        dmsBtLog_1 = local_1264;
        if (local_adc == 2) {
          local_1268 = local_1248->hashLog;
        }
        else {
          local_1268 = local_b20;
        }
        dmsBtMask_1 = local_1268;
        local_126c = commonLengthSmaller_1._4_4_;
        if (local_adc == 2) {
          local_126c = local_1248->chainLog - 1;
        }
        dmsBtLow_1 = local_126c;
        if (local_adc == 2) {
          local_1270 = (1 << ((byte)local_126c & 0x1f)) - 1;
        }
        else {
          local_1270 = 0;
        }
        local_be8 = local_1270;
        if ((local_adc == 2) && (local_1270 < local_125c - local_1260)) {
          local_1274 = local_125c - local_1270;
        }
        else {
          local_1274 = local_1260;
        }
        bestLength_1._4_4_ = local_1274;
        _repCode_1 = (BYTE *)(ulong)(cParams_3._4_4_ - 1);
        repOffset_1 = local_aec + 3;
        for (repIndex_1 = local_aec; repIndex_1 < repOffset_1; repIndex_1 = repIndex_1 + 1) {
          if (repIndex_1 == 3) {
            local_1278 = *local_ae8 - 1;
          }
          else {
            local_1278 = local_ae8[repIndex_1];
          }
          repLen_1 = local_1278;
          local_c08 = minMatch_2 - local_1278;
          repMatch_1._4_4_ = 0;
          if (local_1278 - 1 < minMatch_2 - dictEnd_1._4_4_) {
            UVar24 = ZSTD_readMINMATCH(local_ad0,hashTable_1._4_4_);
            UVar32 = ZSTD_readMINMATCH(local_ad0 + -(ulong)repLen_1,hashTable_1._4_4_);
            if (UVar24 == UVar32) {
              sVar36 = ZSTD_count(local_ad0 + hashTable_1._4_4_,
                                  local_ad0 + ((ulong)hashTable_1._4_4_ - (ulong)repLen_1),local_ad8
                                 );
              repMatch_1._4_4_ = (int)sVar36 + hashTable_1._4_4_;
            }
          }
          else {
            if (local_adc == 2) {
              local_1288 = dmsEnd_1 + ((ulong)local_c08 - (ulong)dmsBtLog_1);
            }
            else {
              local_1288 = pBStack_b68 + local_c08;
            }
            pBStack_c18 = local_1288;
            if ((local_adc == 1) &&
               (local_1278 - 1 < minMatch_2 - local_b88 && 2 < (dictEnd_1._4_4_ - 1) - local_c08)) {
              UVar24 = ZSTD_readMINMATCH(local_ad0,hashTable_1._4_4_);
              UVar32 = ZSTD_readMINMATCH(pBStack_c18,hashTable_1._4_4_);
              if (UVar24 == UVar32) {
                sVar36 = ZSTD_count_2segments
                                   (local_ad0 + hashTable_1._4_4_,pBStack_c18 + hashTable_1._4_4_,
                                    local_ad8,prefixStart_2,_windowLow_1);
                repMatch_1._4_4_ = (int)sVar36 + hashTable_1._4_4_;
              }
            }
            if ((local_adc == 2) &&
               (repLen_1 - 1 < minMatch_2 - (dmsHashLog_1 + dmsBtLog_1) &&
                2 < (dictEnd_1._4_4_ - 1) - local_c08)) {
              UVar24 = ZSTD_readMINMATCH(local_ad0,hashTable_1._4_4_);
              UVar32 = ZSTD_readMINMATCH(pBStack_c18,hashTable_1._4_4_);
              if (UVar24 == UVar32) {
                sVar36 = ZSTD_count_2segments
                                   (local_ad0 + hashTable_1._4_4_,pBStack_c18 + hashTable_1._4_4_,
                                    local_ad8,_dmsLowLimit_1,_windowLow_1);
                repMatch_1._4_4_ = (int)sVar36 + hashTable_1._4_4_;
              }
            }
          }
          if (_repCode_1 < (BYTE *)(ulong)repMatch_1._4_4_) {
            _repCode_1 = (BYTE *)(ulong)repMatch_1._4_4_;
            local_af8[dms_1._4_4_].off = repIndex_1 - local_aec;
            local_af8[dms_1._4_4_].len = repMatch_1._4_4_;
            dms_1._4_4_ = dms_1._4_4_ + 1;
            uVar30 = dms_1._4_4_;
            if (base_3._4_4_ < repMatch_1._4_4_ || local_ad0 + repMatch_1._4_4_ == local_ad8)
            goto LAB_00136eaf;
          }
        }
        if ((((uint)cParams_3 == 3) && (_repCode_1 < (BYTE *)0x3)) &&
           (mlen_1._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_ac8,local_ad0),
           smallerPtr_1._4_4_ <= mlen_1._4_4_ && minMatch_2 - mlen_1._4_4_ < 0x40000)) {
          if (((local_adc == 0) || (local_adc == 2)) || (dictEnd_1._4_4_ <= mlen_1._4_4_)) {
            match_5 = _hashLog_1 + mlen_1._4_4_;
            match_4 = (BYTE *)ZSTD_count(local_ad0,match_5,local_ad8);
          }
          else {
            nextPtr_2 = (U32 *)(pBStack_b68 + mlen_1._4_4_);
            match_4 = (BYTE *)ZSTD_count_2segments
                                        (local_ad0,(BYTE *)nextPtr_2,local_ad8,prefixStart_2,
                                         _windowLow_1);
          }
          if (match_4 < (BYTE *)(ulong)(uint)cParams_3) goto LAB_001367cd;
          _repCode_1 = match_4;
          local_af8->off = (minMatch_2 - mlen_1._4_4_) + 2;
          local_af8->len = (U32)match_4;
          dms_1._4_4_ = 1;
          if (match_4 <= (BYTE *)(ulong)base_3._4_4_ && local_ad0 + (long)match_4 != local_ad8)
          goto LAB_001367cd;
          local_ac8->nextToUpdate = minMatch_2 + 1;
          local_abc = 1;
          uVar30 = local_abc;
        }
        else {
LAB_001367cd:
          *(U32 *)(h_1 + sStack_b38 * 4) = minMatch_2;
          while (iVar23 = (int)dms_1 + -1, bVar39 = (int)dms_1 != 0, dms_1._0_4_ = iVar23,
                bVar39 && smallerPtr_1._4_4_ <= bt_1._4_4_) {
            matchLength_2 = (size_t)(_btMask_1 + ((bt_1._4_4_ & (uint)commonLengthSmaller_1) << 1));
            if (commonLengthLarger_1 < dictBase_1) {
              local_12a0 = (BYTE *)commonLengthLarger_1;
            }
            else {
              local_12a0 = dictBase_1;
            }
            match_6 = local_12a0;
            if (((local_adc == 0) || (local_adc == 2)) ||
               ((BYTE *)(ulong)dictEnd_1._4_4_ <= local_12a0 + bt_1._4_4_)) {
              dmsH_1 = (size_t)(_hashLog_1 + bt_1._4_4_);
              sVar36 = ZSTD_count(local_ad0 + (long)local_12a0,(BYTE *)(dmsH_1 + (long)local_12a0),
                                  local_ad8);
              match_6 = match_6 + sVar36;
            }
            else {
              dmsH_1 = (size_t)(pBStack_b68 + bt_1._4_4_);
              sVar36 = ZSTD_count_2segments
                                 (local_ad0 + (long)local_12a0,(BYTE *)(dmsH_1 + (long)local_12a0),
                                  local_ad8,prefixStart_2,_windowLow_1);
              match_6 = match_6 + sVar36;
              if ((BYTE *)(ulong)dictEnd_1._4_4_ <= match_6 + bt_1._4_4_) {
                dmsH_1 = (size_t)(_hashLog_1 + bt_1._4_4_);
              }
            }
            if (_repCode_1 < match_6) {
              if ((BYTE *)(ulong)(mnum_1 - bt_1._4_4_) < match_6) {
                mnum_1 = bt_1._4_4_ + (U32)match_6;
              }
              _repCode_1 = match_6;
              local_af8[dms_1._4_4_].off = (minMatch_2 - bt_1._4_4_) + 2;
              local_af8[dms_1._4_4_].len = (U32)match_6;
              dms_1._4_4_ = dms_1._4_4_ + 1;
              if ((BYTE *)0x1000 < match_6 || local_ad0 + (long)match_6 == local_ad8) {
                if (local_adc == 2) {
                  dms_1._0_4_ = 0;
                }
                break;
              }
            }
            if (match_6[dmsH_1] < local_ad0[(long)match_6]) {
              *largerPtr_1 = bt_1._4_4_;
              commonLengthLarger_1 = (size_t)match_6;
              if (bt_1._4_4_ <= matchLow_1) {
                largerPtr_1 = &nbCompares_1;
                break;
              }
              largerPtr_1 = (U32 *)(matchLength_2 + 4);
              bt_1._4_4_ = *(uint *)(matchLength_2 + 4);
            }
            else {
              *_dummy32_1 = bt_1._4_4_;
              dictBase_1 = match_6;
              if (bt_1._4_4_ <= matchLow_1) {
                _dummy32_1 = &nbCompares_1;
                break;
              }
              _dummy32_1 = (U32 *)matchLength_2;
              bt_1._4_4_ = *(uint *)matchLength_2;
            }
          }
          *_dummy32_1 = 0;
          *largerPtr_1 = 0;
          if ((local_adc == 2) && ((int)dms_1 != 0)) {
            sStack_c58 = ZSTD_hashPtr(local_ad0,dmsBtMask_1,(uint)cParams_3);
            dmsBt_1._4_4_ = *(uint *)(*(long *)&dmsCParams_1[1].targetLength + sStack_c58 * 4);
            nextPtr_3 = *(U32 **)&dmsCParams_1[2].hashLog;
            dictBase_1 = (BYTE *)0x0;
            commonLengthLarger_1 = 0;
            while (iVar23 = (int)dms_1 + -1, bVar39 = (int)dms_1 != 0, dms_1._0_4_ = iVar23,
                  bVar39 && dmsHashLog_1 < dmsBt_1._4_4_) {
              matchLength_3 = (size_t)(nextPtr_3 + ((dmsBt_1._4_4_ & local_be8) << 1));
              if (commonLengthLarger_1 < dictBase_1) {
                local_12b0 = (BYTE *)commonLengthLarger_1;
              }
              else {
                local_12b0 = dictBase_1;
              }
              match_7 = local_12b0;
              local_c80 = dmsEnd_1 + dmsBt_1._4_4_;
              sVar36 = ZSTD_count_2segments
                                 (local_ad0 + (long)local_12b0,local_c80 + (long)local_12b0,
                                  local_ad8,_dmsLowLimit_1,_windowLow_1);
              match_7 = match_7 + sVar36;
              if ((BYTE *)(ulong)dmsIndexDelta_1 <= match_7 + dmsBt_1._4_4_) {
                local_c80 = _hashLog_1 + (ulong)dmsBtLog_1 + (ulong)dmsBt_1._4_4_;
              }
              if (_repCode_1 < match_7) {
                bt_1._4_4_ = dmsBt_1._4_4_ + dmsBtLog_1;
                if ((BYTE *)(ulong)(mnum_1 - bt_1._4_4_) < match_7) {
                  mnum_1 = bt_1._4_4_ + (U32)match_7;
                }
                local_af8[dms_1._4_4_].off = (minMatch_2 - bt_1._4_4_) + 2;
                local_af8[dms_1._4_4_].len = (U32)match_7;
                dms_1._4_4_ = dms_1._4_4_ + 1;
                _repCode_1 = match_7;
                if ((BYTE *)0x1000 < match_7 || local_ad0 + (long)match_7 == local_ad8) break;
              }
              if (dmsBt_1._4_4_ <= bestLength_1._4_4_) break;
              if (local_c80[(long)match_7] < local_ad0[(long)match_7]) {
                dmsBt_1._4_4_ = *(uint *)(matchLength_3 + 4);
                commonLengthLarger_1 = (size_t)match_7;
              }
              else {
                dmsBt_1._4_4_ = *(uint *)matchLength_3;
                dictBase_1 = match_7;
              }
            }
          }
          local_ac8->nextToUpdate = mnum_1 - 8;
          local_abc = dms_1._4_4_;
          uVar30 = local_abc;
        }
LAB_00136eaf:
        local_abc = uVar30;
        local_ed4 = local_abc;
        dms_1._4_4_ = local_abc;
        break;
      case 5:
        local_908 = anchor;
        local_914 = 0;
        cParams_4._0_4_ = 5;
        pZStack_940 = &ms->cParams;
        if ((ms->cParams).targetLength < 0xfff) {
          local_12b4 = (ms->cParams).targetLength;
        }
        else {
          local_12b4 = 0xfff;
        }
        base_4._4_4_ = local_12b4;
        _hashLog_2 = (ms->window).base;
        minMatch_3 = iVar23 - (int)_hashLog_2;
        local_958 = (ms->cParams).hashLog;
        hashTable_2._4_4_ = 4;
        h_2 = (size_t)ms->hashTable;
        cParams_4._4_4_ = uVar21;
        local_930 = pZVar4;
        local_924 = uVar31;
        local_920 = rep;
        local_910 = iend_00;
        local_900 = ms;
        sStack_970 = ZSTD_hashPtr(anchor,local_958,5);
        bt_2._4_4_ = *(uint *)(h_2 + sStack_970 * 4);
        _btMask_2 = local_900->chainTable;
        commonLengthSmaller_2._4_4_ = pZStack_940->chainLog - 1;
        commonLengthSmaller_2._0_4_ = (1 << ((byte)commonLengthSmaller_2._4_4_ & 0x1f)) - 1;
        commonLengthLarger_2 = 0;
        dictBase_2 = (BYTE *)0x0;
        pBStack_9a0 = (local_900->window).dictBase;
        dictEnd_2._4_4_ = (local_900->window).dictLimit;
        prefixStart_3 = pBStack_9a0 + dictEnd_2._4_4_;
        _windowLow_2 = _hashLog_2 + dictEnd_2._4_4_;
        if ((uint)commonLengthSmaller_2 < minMatch_3) {
          local_12b8 = minMatch_3 - (uint)commonLengthSmaller_2;
        }
        else {
          local_12b8 = 0;
        }
        matchLow_2 = local_12b8;
        local_9c0 = (local_900->window).lowLimit;
        local_12bc = local_9c0;
        if (local_9c0 == 0) {
          local_12bc = 1;
        }
        smallerPtr_2._4_4_ = local_12bc;
        largerPtr_2 = _btMask_2 + ((minMatch_3 & (uint)commonLengthSmaller_2) << 1);
        _dummy32_2 = _btMask_2 + (ulong)((minMatch_3 & (uint)commonLengthSmaller_2) << 1) + 1;
        mnum_2 = minMatch_3 + 9;
        dms_2._4_4_ = 0;
        dms_2._0_4_ = 1 << ((byte)pZStack_940->searchLog & 0x1f);
        if (local_914 == 2) {
          local_12c8 = local_900->dictMatchState;
        }
        else {
          local_12c8 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams_2 = (ZSTD_compressionParameters *)local_12c8;
        if (local_914 == 2) {
          local_12d0 = &local_12c8->cParams;
        }
        else {
          local_12d0 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase_2 = (BYTE *)local_12d0;
        if (local_914 == 2) {
          local_12d8 = (local_12c8->window).base;
        }
        else {
          local_12d8 = (BYTE *)0x0;
        }
        dmsEnd_2 = local_12d8;
        if (local_914 == 2) {
          local_12e0 = (local_12c8->window).nextSrc;
        }
        else {
          local_12e0 = (BYTE *)0x0;
        }
        _dmsLowLimit_2 = local_12e0;
        if (local_914 == 2) {
          local_12e4 = (int)local_12e0 - (int)local_12d8;
        }
        else {
          local_12e4 = 0;
        }
        dmsIndexDelta_2 = local_12e4;
        if (local_914 == 2) {
          local_12e8 = (local_12c8->window).lowLimit;
        }
        else {
          local_12e8 = 0;
        }
        dmsHashLog_2 = local_12e8;
        if (local_914 == 2) {
          local_12ec = local_9c0 - local_12e4;
        }
        else {
          local_12ec = 0;
        }
        dmsBtLog_2 = local_12ec;
        if (local_914 == 2) {
          local_12f0 = local_12d0->hashLog;
        }
        else {
          local_12f0 = local_958;
        }
        dmsBtMask_2 = local_12f0;
        local_12f4 = commonLengthSmaller_2._4_4_;
        if (local_914 == 2) {
          local_12f4 = local_12d0->chainLog - 1;
        }
        dmsBtLow_2 = local_12f4;
        if (local_914 == 2) {
          local_12f8 = (1 << ((byte)local_12f4 & 0x1f)) - 1;
        }
        else {
          local_12f8 = 0;
        }
        local_a20 = local_12f8;
        if ((local_914 == 2) && (local_12f8 < local_12e4 - local_12e8)) {
          local_12fc = local_12e4 - local_12f8;
        }
        else {
          local_12fc = local_12e8;
        }
        bestLength_2._4_4_ = local_12fc;
        _repCode_2 = (BYTE *)(ulong)(cParams_4._4_4_ - 1);
        repOffset_2 = local_924 + 3;
        for (repIndex_2 = local_924; repIndex_2 < repOffset_2; repIndex_2 = repIndex_2 + 1) {
          if (repIndex_2 == 3) {
            local_1300 = *local_920 - 1;
          }
          else {
            local_1300 = local_920[repIndex_2];
          }
          repLen_2 = local_1300;
          local_a40 = minMatch_3 - local_1300;
          repMatch_2._4_4_ = 0;
          if (local_1300 - 1 < minMatch_3 - dictEnd_2._4_4_) {
            UVar24 = ZSTD_readMINMATCH(local_908,hashTable_2._4_4_);
            UVar32 = ZSTD_readMINMATCH(local_908 + -(ulong)repLen_2,hashTable_2._4_4_);
            if (UVar24 == UVar32) {
              sVar36 = ZSTD_count(local_908 + hashTable_2._4_4_,
                                  local_908 + ((ulong)hashTable_2._4_4_ - (ulong)repLen_2),local_910
                                 );
              repMatch_2._4_4_ = (int)sVar36 + hashTable_2._4_4_;
            }
          }
          else {
            if (local_914 == 2) {
              local_1310 = dmsEnd_2 + ((ulong)local_a40 - (ulong)dmsBtLog_2);
            }
            else {
              local_1310 = pBStack_9a0 + local_a40;
            }
            pBStack_a50 = local_1310;
            if ((local_914 == 1) &&
               (local_1300 - 1 < minMatch_3 - local_9c0 && 2 < (dictEnd_2._4_4_ - 1) - local_a40)) {
              UVar24 = ZSTD_readMINMATCH(local_908,hashTable_2._4_4_);
              UVar32 = ZSTD_readMINMATCH(pBStack_a50,hashTable_2._4_4_);
              if (UVar24 == UVar32) {
                sVar36 = ZSTD_count_2segments
                                   (local_908 + hashTable_2._4_4_,pBStack_a50 + hashTable_2._4_4_,
                                    local_910,prefixStart_3,_windowLow_2);
                repMatch_2._4_4_ = (int)sVar36 + hashTable_2._4_4_;
              }
            }
            if ((local_914 == 2) &&
               (repLen_2 - 1 < minMatch_3 - (dmsHashLog_2 + dmsBtLog_2) &&
                2 < (dictEnd_2._4_4_ - 1) - local_a40)) {
              UVar24 = ZSTD_readMINMATCH(local_908,hashTable_2._4_4_);
              UVar32 = ZSTD_readMINMATCH(pBStack_a50,hashTable_2._4_4_);
              if (UVar24 == UVar32) {
                sVar36 = ZSTD_count_2segments
                                   (local_908 + hashTable_2._4_4_,pBStack_a50 + hashTable_2._4_4_,
                                    local_910,_dmsLowLimit_2,_windowLow_2);
                repMatch_2._4_4_ = (int)sVar36 + hashTable_2._4_4_;
              }
            }
          }
          if (_repCode_2 < (BYTE *)(ulong)repMatch_2._4_4_) {
            _repCode_2 = (BYTE *)(ulong)repMatch_2._4_4_;
            local_930[dms_2._4_4_].off = repIndex_2 - local_924;
            local_930[dms_2._4_4_].len = repMatch_2._4_4_;
            dms_2._4_4_ = dms_2._4_4_ + 1;
            uVar30 = dms_2._4_4_;
            if (base_4._4_4_ < repMatch_2._4_4_ || local_908 + repMatch_2._4_4_ == local_910)
            goto LAB_001380d4;
          }
        }
        if ((((uint)cParams_4 == 3) && (_repCode_2 < (BYTE *)0x3)) &&
           (mlen_2._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_900,local_908),
           smallerPtr_2._4_4_ <= mlen_2._4_4_ && minMatch_3 - mlen_2._4_4_ < 0x40000)) {
          if (((local_914 == 0) || (local_914 == 2)) || (dictEnd_2._4_4_ <= mlen_2._4_4_)) {
            match_9 = _hashLog_2 + mlen_2._4_4_;
            match_8 = (BYTE *)ZSTD_count(local_908,match_9,local_910);
          }
          else {
            nextPtr_4 = (U32 *)(pBStack_9a0 + mlen_2._4_4_);
            match_8 = (BYTE *)ZSTD_count_2segments
                                        (local_908,(BYTE *)nextPtr_4,local_910,prefixStart_3,
                                         _windowLow_2);
          }
          if (match_8 < (BYTE *)(ulong)(uint)cParams_4) goto LAB_001379f2;
          _repCode_2 = match_8;
          local_930->off = (minMatch_3 - mlen_2._4_4_) + 2;
          local_930->len = (U32)match_8;
          dms_2._4_4_ = 1;
          if (match_8 <= (BYTE *)(ulong)base_4._4_4_ && local_908 + (long)match_8 != local_910)
          goto LAB_001379f2;
          local_900->nextToUpdate = minMatch_3 + 1;
          local_8f4 = 1;
          uVar30 = local_8f4;
        }
        else {
LAB_001379f2:
          *(U32 *)(h_2 + sStack_970 * 4) = minMatch_3;
          while (iVar23 = (int)dms_2 + -1, bVar39 = (int)dms_2 != 0, dms_2._0_4_ = iVar23,
                bVar39 && smallerPtr_2._4_4_ <= bt_2._4_4_) {
            matchLength_4 = (size_t)(_btMask_2 + ((bt_2._4_4_ & (uint)commonLengthSmaller_2) << 1));
            if (commonLengthLarger_2 < dictBase_2) {
              local_1328 = (BYTE *)commonLengthLarger_2;
            }
            else {
              local_1328 = dictBase_2;
            }
            match_10 = local_1328;
            if (((local_914 == 0) || (local_914 == 2)) ||
               ((BYTE *)(ulong)dictEnd_2._4_4_ <= local_1328 + bt_2._4_4_)) {
              dmsH_2 = (size_t)(_hashLog_2 + bt_2._4_4_);
              sVar36 = ZSTD_count(local_908 + (long)local_1328,(BYTE *)(dmsH_2 + (long)local_1328),
                                  local_910);
              match_10 = match_10 + sVar36;
            }
            else {
              dmsH_2 = (size_t)(pBStack_9a0 + bt_2._4_4_);
              sVar36 = ZSTD_count_2segments
                                 (local_908 + (long)local_1328,(BYTE *)(dmsH_2 + (long)local_1328),
                                  local_910,prefixStart_3,_windowLow_2);
              match_10 = match_10 + sVar36;
              if ((BYTE *)(ulong)dictEnd_2._4_4_ <= match_10 + bt_2._4_4_) {
                dmsH_2 = (size_t)(_hashLog_2 + bt_2._4_4_);
              }
            }
            if (_repCode_2 < match_10) {
              if ((BYTE *)(ulong)(mnum_2 - bt_2._4_4_) < match_10) {
                mnum_2 = bt_2._4_4_ + (U32)match_10;
              }
              _repCode_2 = match_10;
              local_930[dms_2._4_4_].off = (minMatch_3 - bt_2._4_4_) + 2;
              local_930[dms_2._4_4_].len = (U32)match_10;
              dms_2._4_4_ = dms_2._4_4_ + 1;
              if ((BYTE *)0x1000 < match_10 || local_908 + (long)match_10 == local_910) {
                if (local_914 == 2) {
                  dms_2._0_4_ = 0;
                }
                break;
              }
            }
            if (match_10[dmsH_2] < local_908[(long)match_10]) {
              *largerPtr_2 = bt_2._4_4_;
              commonLengthLarger_2 = (size_t)match_10;
              if (bt_2._4_4_ <= matchLow_2) {
                largerPtr_2 = &nbCompares_2;
                break;
              }
              largerPtr_2 = (U32 *)(matchLength_4 + 4);
              bt_2._4_4_ = *(uint *)(matchLength_4 + 4);
            }
            else {
              *_dummy32_2 = bt_2._4_4_;
              dictBase_2 = match_10;
              if (bt_2._4_4_ <= matchLow_2) {
                _dummy32_2 = &nbCompares_2;
                break;
              }
              _dummy32_2 = (U32 *)matchLength_4;
              bt_2._4_4_ = *(uint *)matchLength_4;
            }
          }
          *_dummy32_2 = 0;
          *largerPtr_2 = 0;
          if ((local_914 == 2) && ((int)dms_2 != 0)) {
            sStack_a90 = ZSTD_hashPtr(local_908,dmsBtMask_2,(uint)cParams_4);
            dmsBt_2._4_4_ = *(uint *)(*(long *)&dmsCParams_2[1].targetLength + sStack_a90 * 4);
            nextPtr_5 = *(U32 **)&dmsCParams_2[2].hashLog;
            dictBase_2 = (BYTE *)0x0;
            commonLengthLarger_2 = 0;
            while (iVar23 = (int)dms_2 + -1, bVar39 = (int)dms_2 != 0, dms_2._0_4_ = iVar23,
                  bVar39 && dmsHashLog_2 < dmsBt_2._4_4_) {
              matchLength_5 = (size_t)(nextPtr_5 + ((dmsBt_2._4_4_ & local_a20) << 1));
              if (commonLengthLarger_2 < dictBase_2) {
                local_1338 = (BYTE *)commonLengthLarger_2;
              }
              else {
                local_1338 = dictBase_2;
              }
              match_11 = local_1338;
              local_ab8 = dmsEnd_2 + dmsBt_2._4_4_;
              sVar36 = ZSTD_count_2segments
                                 (local_908 + (long)local_1338,local_ab8 + (long)local_1338,
                                  local_910,_dmsLowLimit_2,_windowLow_2);
              match_11 = match_11 + sVar36;
              if ((BYTE *)(ulong)dmsIndexDelta_2 <= match_11 + dmsBt_2._4_4_) {
                local_ab8 = _hashLog_2 + (ulong)dmsBtLog_2 + (ulong)dmsBt_2._4_4_;
              }
              if (_repCode_2 < match_11) {
                bt_2._4_4_ = dmsBt_2._4_4_ + dmsBtLog_2;
                if ((BYTE *)(ulong)(mnum_2 - bt_2._4_4_) < match_11) {
                  mnum_2 = bt_2._4_4_ + (U32)match_11;
                }
                local_930[dms_2._4_4_].off = (minMatch_3 - bt_2._4_4_) + 2;
                local_930[dms_2._4_4_].len = (U32)match_11;
                dms_2._4_4_ = dms_2._4_4_ + 1;
                _repCode_2 = match_11;
                if ((BYTE *)0x1000 < match_11 || local_908 + (long)match_11 == local_910) break;
              }
              if (dmsBt_2._4_4_ <= bestLength_2._4_4_) break;
              if (local_ab8[(long)match_11] < local_908[(long)match_11]) {
                dmsBt_2._4_4_ = *(uint *)(matchLength_5 + 4);
                commonLengthLarger_2 = (size_t)match_11;
              }
              else {
                dmsBt_2._4_4_ = *(uint *)matchLength_5;
                dictBase_2 = match_11;
              }
            }
          }
          local_900->nextToUpdate = mnum_2 - 8;
          local_8f4 = dms_2._4_4_;
          uVar30 = local_8f4;
        }
LAB_001380d4:
        local_8f4 = uVar30;
        local_ed4 = local_8f4;
        dms_2._4_4_ = local_8f4;
        break;
      case 6:
      case 7:
        local_740 = anchor;
        local_74c = 0;
        cParams_5._0_4_ = 6;
        pZStack_778 = &ms->cParams;
        if ((ms->cParams).targetLength < 0xfff) {
          local_133c = (ms->cParams).targetLength;
        }
        else {
          local_133c = 0xfff;
        }
        base_5._4_4_ = local_133c;
        _hashLog_3 = (ms->window).base;
        minMatch_4 = iVar23 - (int)_hashLog_3;
        local_790 = (ms->cParams).hashLog;
        hashTable_3._4_4_ = 4;
        h_3 = (size_t)ms->hashTable;
        cParams_5._4_4_ = uVar21;
        local_768 = pZVar4;
        local_75c = uVar31;
        local_758 = rep;
        local_748 = iend_00;
        local_738 = ms;
        sStack_7a8 = ZSTD_hashPtr(anchor,local_790,6);
        bt_3._4_4_ = *(uint *)(h_3 + sStack_7a8 * 4);
        _btMask_3 = local_738->chainTable;
        commonLengthSmaller_3._4_4_ = pZStack_778->chainLog - 1;
        commonLengthSmaller_3._0_4_ = (1 << ((byte)commonLengthSmaller_3._4_4_ & 0x1f)) - 1;
        commonLengthLarger_3 = 0;
        dictBase_3 = (BYTE *)0x0;
        pBStack_7d8 = (local_738->window).dictBase;
        dictEnd_3._4_4_ = (local_738->window).dictLimit;
        prefixStart_4 = pBStack_7d8 + dictEnd_3._4_4_;
        _windowLow_3 = _hashLog_3 + dictEnd_3._4_4_;
        if ((uint)commonLengthSmaller_3 < minMatch_4) {
          local_1340 = minMatch_4 - (uint)commonLengthSmaller_3;
        }
        else {
          local_1340 = 0;
        }
        matchLow_3 = local_1340;
        local_7f8 = (local_738->window).lowLimit;
        local_1344 = local_7f8;
        if (local_7f8 == 0) {
          local_1344 = 1;
        }
        smallerPtr_3._4_4_ = local_1344;
        largerPtr_3 = _btMask_3 + ((minMatch_4 & (uint)commonLengthSmaller_3) << 1);
        _dummy32_3 = _btMask_3 + (ulong)((minMatch_4 & (uint)commonLengthSmaller_3) << 1) + 1;
        mnum_3 = minMatch_4 + 9;
        dms_3._4_4_ = 0;
        dms_3._0_4_ = 1 << ((byte)pZStack_778->searchLog & 0x1f);
        if (local_74c == 2) {
          local_1350 = local_738->dictMatchState;
        }
        else {
          local_1350 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams_3 = (ZSTD_compressionParameters *)local_1350;
        if (local_74c == 2) {
          local_1358 = &local_1350->cParams;
        }
        else {
          local_1358 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase_3 = (BYTE *)local_1358;
        if (local_74c == 2) {
          local_1360 = (local_1350->window).base;
        }
        else {
          local_1360 = (BYTE *)0x0;
        }
        dmsEnd_3 = local_1360;
        if (local_74c == 2) {
          local_1368 = (local_1350->window).nextSrc;
        }
        else {
          local_1368 = (BYTE *)0x0;
        }
        _dmsLowLimit_3 = local_1368;
        if (local_74c == 2) {
          local_136c = (int)local_1368 - (int)local_1360;
        }
        else {
          local_136c = 0;
        }
        dmsIndexDelta_3 = local_136c;
        if (local_74c == 2) {
          local_1370 = (local_1350->window).lowLimit;
        }
        else {
          local_1370 = 0;
        }
        dmsHashLog_3 = local_1370;
        if (local_74c == 2) {
          local_1374 = local_7f8 - local_136c;
        }
        else {
          local_1374 = 0;
        }
        dmsBtLog_3 = local_1374;
        if (local_74c == 2) {
          local_1378 = local_1358->hashLog;
        }
        else {
          local_1378 = local_790;
        }
        dmsBtMask_3 = local_1378;
        local_137c = commonLengthSmaller_3._4_4_;
        if (local_74c == 2) {
          local_137c = local_1358->chainLog - 1;
        }
        dmsBtLow_3 = local_137c;
        if (local_74c == 2) {
          local_1380 = (1 << ((byte)local_137c & 0x1f)) - 1;
        }
        else {
          local_1380 = 0;
        }
        local_858 = local_1380;
        if ((local_74c == 2) && (local_1380 < local_136c - local_1370)) {
          local_1384 = local_136c - local_1380;
        }
        else {
          local_1384 = local_1370;
        }
        bestLength_3._4_4_ = local_1384;
        _repCode_3 = (BYTE *)(ulong)(cParams_5._4_4_ - 1);
        repOffset_3 = local_75c + 3;
        for (repIndex_3 = local_75c; repIndex_3 < repOffset_3; repIndex_3 = repIndex_3 + 1) {
          if (repIndex_3 == 3) {
            local_1388 = *local_758 - 1;
          }
          else {
            local_1388 = local_758[repIndex_3];
          }
          repLen_3 = local_1388;
          local_878 = minMatch_4 - local_1388;
          repMatch_3._4_4_ = 0;
          if (local_1388 - 1 < minMatch_4 - dictEnd_3._4_4_) {
            UVar24 = ZSTD_readMINMATCH(local_740,hashTable_3._4_4_);
            UVar32 = ZSTD_readMINMATCH(local_740 + -(ulong)repLen_3,hashTable_3._4_4_);
            if (UVar24 == UVar32) {
              sVar36 = ZSTD_count(local_740 + hashTable_3._4_4_,
                                  local_740 + ((ulong)hashTable_3._4_4_ - (ulong)repLen_3),local_748
                                 );
              repMatch_3._4_4_ = (int)sVar36 + hashTable_3._4_4_;
            }
          }
          else {
            if (local_74c == 2) {
              local_1398 = dmsEnd_3 + ((ulong)local_878 - (ulong)dmsBtLog_3);
            }
            else {
              local_1398 = pBStack_7d8 + local_878;
            }
            pBStack_888 = local_1398;
            if ((local_74c == 1) &&
               (local_1388 - 1 < minMatch_4 - local_7f8 && 2 < (dictEnd_3._4_4_ - 1) - local_878)) {
              UVar24 = ZSTD_readMINMATCH(local_740,hashTable_3._4_4_);
              UVar32 = ZSTD_readMINMATCH(pBStack_888,hashTable_3._4_4_);
              if (UVar24 == UVar32) {
                sVar36 = ZSTD_count_2segments
                                   (local_740 + hashTable_3._4_4_,pBStack_888 + hashTable_3._4_4_,
                                    local_748,prefixStart_4,_windowLow_3);
                repMatch_3._4_4_ = (int)sVar36 + hashTable_3._4_4_;
              }
            }
            if ((local_74c == 2) &&
               (repLen_3 - 1 < minMatch_4 - (dmsHashLog_3 + dmsBtLog_3) &&
                2 < (dictEnd_3._4_4_ - 1) - local_878)) {
              UVar24 = ZSTD_readMINMATCH(local_740,hashTable_3._4_4_);
              UVar32 = ZSTD_readMINMATCH(pBStack_888,hashTable_3._4_4_);
              if (UVar24 == UVar32) {
                sVar36 = ZSTD_count_2segments
                                   (local_740 + hashTable_3._4_4_,pBStack_888 + hashTable_3._4_4_,
                                    local_748,_dmsLowLimit_3,_windowLow_3);
                repMatch_3._4_4_ = (int)sVar36 + hashTable_3._4_4_;
              }
            }
          }
          if (_repCode_3 < (BYTE *)(ulong)repMatch_3._4_4_) {
            _repCode_3 = (BYTE *)(ulong)repMatch_3._4_4_;
            local_768[dms_3._4_4_].off = repIndex_3 - local_75c;
            local_768[dms_3._4_4_].len = repMatch_3._4_4_;
            dms_3._4_4_ = dms_3._4_4_ + 1;
            uVar30 = dms_3._4_4_;
            if (base_5._4_4_ < repMatch_3._4_4_ || local_740 + repMatch_3._4_4_ == local_748)
            goto LAB_001392f9;
          }
        }
        if ((((uint)cParams_5 == 3) && (_repCode_3 < (BYTE *)0x3)) &&
           (mlen_3._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_738,local_740),
           smallerPtr_3._4_4_ <= mlen_3._4_4_ && minMatch_4 - mlen_3._4_4_ < 0x40000)) {
          if (((local_74c == 0) || (local_74c == 2)) || (dictEnd_3._4_4_ <= mlen_3._4_4_)) {
            match_13 = _hashLog_3 + mlen_3._4_4_;
            match_12 = (BYTE *)ZSTD_count(local_740,match_13,local_748);
          }
          else {
            nextPtr_6 = (U32 *)(pBStack_7d8 + mlen_3._4_4_);
            match_12 = (BYTE *)ZSTD_count_2segments
                                         (local_740,(BYTE *)nextPtr_6,local_748,prefixStart_4,
                                          _windowLow_3);
          }
          if (match_12 < (BYTE *)(ulong)(uint)cParams_5) goto LAB_00138c17;
          _repCode_3 = match_12;
          local_768->off = (minMatch_4 - mlen_3._4_4_) + 2;
          local_768->len = (U32)match_12;
          dms_3._4_4_ = 1;
          if (match_12 <= (BYTE *)(ulong)base_5._4_4_ && local_740 + (long)match_12 != local_748)
          goto LAB_00138c17;
          local_738->nextToUpdate = minMatch_4 + 1;
          local_72c = 1;
          uVar30 = local_72c;
        }
        else {
LAB_00138c17:
          *(U32 *)(h_3 + sStack_7a8 * 4) = minMatch_4;
          while (iVar23 = (int)dms_3 + -1, bVar39 = (int)dms_3 != 0, dms_3._0_4_ = iVar23,
                bVar39 && smallerPtr_3._4_4_ <= bt_3._4_4_) {
            matchLength_6 = (size_t)(_btMask_3 + ((bt_3._4_4_ & (uint)commonLengthSmaller_3) << 1));
            if (commonLengthLarger_3 < dictBase_3) {
              local_13b0 = (BYTE *)commonLengthLarger_3;
            }
            else {
              local_13b0 = dictBase_3;
            }
            match_14 = local_13b0;
            if (((local_74c == 0) || (local_74c == 2)) ||
               ((BYTE *)(ulong)dictEnd_3._4_4_ <= local_13b0 + bt_3._4_4_)) {
              dmsH_3 = (size_t)(_hashLog_3 + bt_3._4_4_);
              sVar36 = ZSTD_count(local_740 + (long)local_13b0,(BYTE *)(dmsH_3 + (long)local_13b0),
                                  local_748);
              match_14 = match_14 + sVar36;
            }
            else {
              dmsH_3 = (size_t)(pBStack_7d8 + bt_3._4_4_);
              sVar36 = ZSTD_count_2segments
                                 (local_740 + (long)local_13b0,(BYTE *)(dmsH_3 + (long)local_13b0),
                                  local_748,prefixStart_4,_windowLow_3);
              match_14 = match_14 + sVar36;
              if ((BYTE *)(ulong)dictEnd_3._4_4_ <= match_14 + bt_3._4_4_) {
                dmsH_3 = (size_t)(_hashLog_3 + bt_3._4_4_);
              }
            }
            if (_repCode_3 < match_14) {
              if ((BYTE *)(ulong)(mnum_3 - bt_3._4_4_) < match_14) {
                mnum_3 = bt_3._4_4_ + (U32)match_14;
              }
              _repCode_3 = match_14;
              local_768[dms_3._4_4_].off = (minMatch_4 - bt_3._4_4_) + 2;
              local_768[dms_3._4_4_].len = (U32)match_14;
              dms_3._4_4_ = dms_3._4_4_ + 1;
              if ((BYTE *)0x1000 < match_14 || local_740 + (long)match_14 == local_748) {
                if (local_74c == 2) {
                  dms_3._0_4_ = 0;
                }
                break;
              }
            }
            if (match_14[dmsH_3] < local_740[(long)match_14]) {
              *largerPtr_3 = bt_3._4_4_;
              commonLengthLarger_3 = (size_t)match_14;
              if (bt_3._4_4_ <= matchLow_3) {
                largerPtr_3 = &nbCompares_3;
                break;
              }
              largerPtr_3 = (U32 *)(matchLength_6 + 4);
              bt_3._4_4_ = *(uint *)(matchLength_6 + 4);
            }
            else {
              *_dummy32_3 = bt_3._4_4_;
              dictBase_3 = match_14;
              if (bt_3._4_4_ <= matchLow_3) {
                _dummy32_3 = &nbCompares_3;
                break;
              }
              _dummy32_3 = (U32 *)matchLength_6;
              bt_3._4_4_ = *(uint *)matchLength_6;
            }
          }
          *_dummy32_3 = 0;
          *largerPtr_3 = 0;
          if ((local_74c == 2) && ((int)dms_3 != 0)) {
            sStack_8c8 = ZSTD_hashPtr(local_740,dmsBtMask_3,(uint)cParams_5);
            dmsBt_3._4_4_ = *(uint *)(*(long *)&dmsCParams_3[1].targetLength + sStack_8c8 * 4);
            nextPtr_7 = *(U32 **)&dmsCParams_3[2].hashLog;
            dictBase_3 = (BYTE *)0x0;
            commonLengthLarger_3 = 0;
            while (iVar23 = (int)dms_3 + -1, bVar39 = (int)dms_3 != 0, dms_3._0_4_ = iVar23,
                  bVar39 && dmsHashLog_3 < dmsBt_3._4_4_) {
              matchLength_7 = (size_t)(nextPtr_7 + ((dmsBt_3._4_4_ & local_858) << 1));
              if (commonLengthLarger_3 < dictBase_3) {
                local_13c0 = (BYTE *)commonLengthLarger_3;
              }
              else {
                local_13c0 = dictBase_3;
              }
              match_15 = local_13c0;
              local_8f0 = dmsEnd_3 + dmsBt_3._4_4_;
              sVar36 = ZSTD_count_2segments
                                 (local_740 + (long)local_13c0,local_8f0 + (long)local_13c0,
                                  local_748,_dmsLowLimit_3,_windowLow_3);
              match_15 = match_15 + sVar36;
              if ((BYTE *)(ulong)dmsIndexDelta_3 <= match_15 + dmsBt_3._4_4_) {
                local_8f0 = _hashLog_3 + (ulong)dmsBtLog_3 + (ulong)dmsBt_3._4_4_;
              }
              if (_repCode_3 < match_15) {
                bt_3._4_4_ = dmsBt_3._4_4_ + dmsBtLog_3;
                if ((BYTE *)(ulong)(mnum_3 - bt_3._4_4_) < match_15) {
                  mnum_3 = bt_3._4_4_ + (U32)match_15;
                }
                local_768[dms_3._4_4_].off = (minMatch_4 - bt_3._4_4_) + 2;
                local_768[dms_3._4_4_].len = (U32)match_15;
                dms_3._4_4_ = dms_3._4_4_ + 1;
                _repCode_3 = match_15;
                if ((BYTE *)0x1000 < match_15 || local_740 + (long)match_15 == local_748) break;
              }
              if (dmsBt_3._4_4_ <= bestLength_3._4_4_) break;
              if (local_8f0[(long)match_15] < local_740[(long)match_15]) {
                dmsBt_3._4_4_ = *(uint *)(matchLength_7 + 4);
                commonLengthLarger_3 = (size_t)match_15;
              }
              else {
                dmsBt_3._4_4_ = *(uint *)matchLength_7;
                dictBase_3 = match_15;
              }
            }
          }
          local_738->nextToUpdate = mnum_3 - 8;
          local_72c = dms_3._4_4_;
          uVar30 = local_72c;
        }
LAB_001392f9:
        local_72c = uVar30;
        local_ed4 = local_72c;
        dms_3._4_4_ = local_72c;
      }
    }
    if (local_ed4 == 0) {
      anchor = anchor + 1;
    }
    else {
      for (maxOffset = 0; maxOffset < 3; maxOffset = maxOffset + 1) {
        pZVar3->rep[maxOffset] = rep[maxOffset];
      }
      pZVar3->mlen = 0;
      pZVar3->litlen = lastSequence.off;
      iVar23 = ZSTD_literalsContribution(iend,lastSequence.off,optPtr,2);
      pZVar3->price = iVar23;
      lastSequence.price = pZVar4[local_ed4 - 1].len;
      if (local_1198 < (uint)lastSequence.price) {
        _last_pos = CONCAT44(pZVar4[local_ed4 - 1].off,last_pos);
        litlen = 0;
        sol.mlen = lastSequence.mlen;
        sol.litlen = lastSequence.litlen;
        sol.price = lastSequence.price;
        sol.off = lastSequence.off;
        sol.rep[0] = lastSequence.rep[0];
        sol.rep[1] = (int)in_stack_ffffffffffffe994;
        sol.rep[2] = (int)((ulong)in_stack_ffffffffffffe994 >> 0x20);
        ZSTD_totalLen(sol);
      }
      else {
        iVar23 = pZVar3->price;
        UVar24 = ZSTD_litLengthPrice(0,optPtr,2);
        for (offset = 1; offset < uVar21; offset = offset + 1) {
          pZVar3[offset].price = 0x40000000;
        }
        for (end = 0; end < local_ed4; end = end + 1) {
          UVar32 = pZVar4[end].off;
          uVar30 = pZVar4[end].len;
          rVar40 = ZSTD_updateRep(rep,UVar32,uVar31);
          _sequencePrice = rVar40.rep._0_8_;
          local_10a8 = rVar40.rep[2];
          for (; offset <= uVar30; offset = offset + 1) {
            UVar25 = ZSTD_highbit32(UVar32 + 1);
            if ((ms->opt).priceType == zop_predef) {
              UVar26 = ZSTD_fracWeight(offset - 3);
              local_e78 = UVar26 + (UVar25 + 0x10) * 0x100;
            }
            else {
              UVar26 = (ms->opt).offCodeSumBasePrice;
              UVar27 = ZSTD_fracWeight((ms->opt).offCodeFreq[UVar25]);
              UVar28 = ZSTD_MLcode(offset - 3);
              UVar1 = ML_bits[UVar28];
              UVar2 = (ms->opt).matchLengthSumBasePrice;
              UVar28 = ZSTD_fracWeight((ms->opt).matchLengthFreq[UVar28]);
              local_e78 = UVar1 * 0x100 + (UVar2 - UVar28) + UVar25 * 0x100 + (UVar26 - UVar27) +
                          0x33;
            }
            pZVar3[offset].mlen = offset;
            pZVar3[offset].off = UVar32;
            pZVar3[offset].litlen = lastSequence.off;
            pZVar3[offset].price = iVar23 + UVar24 + local_e78;
            *(undefined8 *)pZVar3[offset].rep = _sequencePrice;
            pZVar3[offset].rep[2] = local_10a8;
          }
        }
        ll0 = offset - 1;
        for (litlen = 1; litlen <= ll0; litlen = litlen + 1) {
          pBVar35 = anchor + litlen;
          if (pZVar3[litlen - 1].mlen == 0) {
            local_13e4 = pZVar3[litlen - 1].litlen + 1;
          }
          else {
            local_13e4 = 1;
          }
          iVar23 = pZVar3[litlen - 1].price;
          UVar24 = ZSTD_rawLiteralsCost(anchor + ((ulong)litlen - 1),1,optPtr,2);
          UVar32 = ZSTD_litLengthPrice(local_13e4,optPtr,2);
          UVar25 = ZSTD_litLengthPrice(local_13e4 - 1,optPtr,2);
          iVar23 = (iVar23 + UVar24 + UVar32) - UVar25;
          if (iVar23 <= pZVar3[litlen].price) {
            pZVar3[litlen].mlen = 0;
            pZVar3[litlen].off = 0;
            pZVar3[litlen].litlen = local_13e4;
            pZVar3[litlen].price = iVar23;
            *(undefined8 *)pZVar3[litlen].rep = *(undefined8 *)pZVar3[litlen - 1].rep;
            pZVar3[litlen].rep[2] = pZVar3[litlen - 1].rep[2];
          }
          if (pBVar35 <= iend_00 + -8) {
            if (litlen == ll0) break;
            uVar31 = (uint)(pZVar3[litlen].mlen != 0);
            if (pZVar3[litlen].mlen == 0) {
              local_13f4 = pZVar3[litlen].litlen;
            }
            else {
              local_13f4 = 0;
            }
            iVar23 = pZVar3[litlen].price;
            UVar32 = ZSTD_litLengthPrice(0,optPtr,2);
            pUVar34 = pZVar3[litlen].rep;
            UVar24 = (ms->cParams).minMatch;
            if (pBVar35 < (ms->window).base + ms->nextToUpdate) {
              local_f5c = 0;
            }
            else {
              pBVar5 = (ms->window).base;
              iVar29 = (int)pBVar35;
              uVar30 = iVar29 - (int)pBVar5;
              for (local_f58 = ms->nextToUpdate; local_f58 < uVar30; local_f58 = UVar25 + local_f58)
              {
                UVar25 = ZSTD_insertBt1(ms,pBVar5 + local_f58,iend_00,UVar24,0);
              }
              ms->nextToUpdate = uVar30;
              switch(UVar24) {
              case 3:
                local_584 = 0;
                cParams_7._0_4_ = 3;
                pZStack_5b0 = &ms->cParams;
                if ((ms->cParams).targetLength < 0xfff) {
                  local_1404 = (ms->cParams).targetLength;
                }
                else {
                  local_1404 = 0xfff;
                }
                base_7._4_4_ = local_1404;
                _hashLog_4 = (ms->window).base;
                minMatch_5 = iVar29 - (int)_hashLog_4;
                local_5c8 = (ms->cParams).hashLog;
                hashTable_4._4_4_ = 3;
                h_4 = (size_t)ms->hashTable;
                cParams_7._4_4_ = uVar21;
                local_5a0 = pZVar4;
                local_594 = uVar31;
                local_590 = pUVar34;
                local_580 = iend_00;
                local_578 = pBVar35;
                local_570 = ms;
                sStack_5e0 = ZSTD_hashPtr(pBVar35,local_5c8,3);
                bt_4._4_4_ = *(uint *)(h_4 + sStack_5e0 * 4);
                _btMask_4 = local_570->chainTable;
                commonLengthSmaller_4._4_4_ = pZStack_5b0->chainLog - 1;
                commonLengthSmaller_4._0_4_ = (1 << ((byte)commonLengthSmaller_4._4_4_ & 0x1f)) - 1;
                commonLengthLarger_4 = 0;
                dictBase_4 = (BYTE *)0x0;
                pBStack_610 = (local_570->window).dictBase;
                dictEnd_4._4_4_ = (local_570->window).dictLimit;
                prefixStart_5 = pBStack_610 + dictEnd_4._4_4_;
                _windowLow_4 = _hashLog_4 + dictEnd_4._4_4_;
                if ((uint)commonLengthSmaller_4 < minMatch_5) {
                  local_1408 = minMatch_5 - (uint)commonLengthSmaller_4;
                }
                else {
                  local_1408 = 0;
                }
                matchLow_4 = local_1408;
                local_630 = (local_570->window).lowLimit;
                local_140c = local_630;
                if (local_630 == 0) {
                  local_140c = 1;
                }
                smallerPtr_4._4_4_ = local_140c;
                largerPtr_4 = _btMask_4 + ((minMatch_5 & (uint)commonLengthSmaller_4) << 1);
                _dummy32_4 = _btMask_4 +
                             (ulong)((minMatch_5 & (uint)commonLengthSmaller_4) << 1) + 1;
                mnum_4 = minMatch_5 + 9;
                dms_4._4_4_ = 0;
                dms_4._0_4_ = 1 << ((byte)pZStack_5b0->searchLog & 0x1f);
                if (local_584 == 2) {
                  local_1418 = local_570->dictMatchState;
                }
                else {
                  local_1418 = (ZSTD_matchState_t *)0x0;
                }
                dmsCParams_4 = (ZSTD_compressionParameters *)local_1418;
                if (local_584 == 2) {
                  local_1420 = &local_1418->cParams;
                }
                else {
                  local_1420 = (ZSTD_compressionParameters *)0x0;
                }
                dmsBase_4 = (BYTE *)local_1420;
                if (local_584 == 2) {
                  local_1428 = (local_1418->window).base;
                }
                else {
                  local_1428 = (BYTE *)0x0;
                }
                dmsEnd_4 = local_1428;
                if (local_584 == 2) {
                  local_1430 = (local_1418->window).nextSrc;
                }
                else {
                  local_1430 = (BYTE *)0x0;
                }
                _dmsLowLimit_4 = local_1430;
                if (local_584 == 2) {
                  local_1434 = (int)local_1430 - (int)local_1428;
                }
                else {
                  local_1434 = 0;
                }
                dmsIndexDelta_4 = local_1434;
                if (local_584 == 2) {
                  local_1438 = (local_1418->window).lowLimit;
                }
                else {
                  local_1438 = 0;
                }
                dmsHashLog_4 = local_1438;
                if (local_584 == 2) {
                  local_143c = local_630 - local_1434;
                }
                else {
                  local_143c = 0;
                }
                dmsBtLog_4 = local_143c;
                if (local_584 == 2) {
                  local_1440 = local_1420->hashLog;
                }
                else {
                  local_1440 = local_5c8;
                }
                dmsBtMask_4 = local_1440;
                local_1444 = commonLengthSmaller_4._4_4_;
                if (local_584 == 2) {
                  local_1444 = local_1420->chainLog - 1;
                }
                dmsBtLow_4 = local_1444;
                if (local_584 == 2) {
                  local_1448 = (1 << ((byte)local_1444 & 0x1f)) - 1;
                }
                else {
                  local_1448 = 0;
                }
                local_690 = local_1448;
                if ((local_584 == 2) && (local_1448 < local_1434 - local_1438)) {
                  local_144c = local_1434 - local_1448;
                }
                else {
                  local_144c = local_1438;
                }
                bestLength_4._4_4_ = local_144c;
                _repCode_4 = (BYTE *)(ulong)(cParams_7._4_4_ - 1);
                repOffset_4 = local_594 + 3;
                for (repIndex_4 = local_594; repIndex_4 < repOffset_4; repIndex_4 = repIndex_4 + 1)
                {
                  if (repIndex_4 == 3) {
                    local_1450 = *local_590 - 1;
                  }
                  else {
                    local_1450 = local_590[repIndex_4];
                  }
                  repLen_4 = local_1450;
                  local_6b0 = minMatch_5 - local_1450;
                  repMatch_4._4_4_ = 0;
                  if (local_1450 - 1 < minMatch_5 - dictEnd_4._4_4_) {
                    UVar24 = ZSTD_readMINMATCH(local_578,hashTable_4._4_4_);
                    UVar25 = ZSTD_readMINMATCH(local_578 + -(ulong)repLen_4,hashTable_4._4_4_);
                    if (UVar24 == UVar25) {
                      sVar36 = ZSTD_count(local_578 + hashTable_4._4_4_,
                                          local_578 + ((ulong)hashTable_4._4_4_ - (ulong)repLen_4),
                                          local_580);
                      repMatch_4._4_4_ = (int)sVar36 + hashTable_4._4_4_;
                    }
                  }
                  else {
                    if (local_584 == 2) {
                      local_1460 = dmsEnd_4 + ((ulong)local_6b0 - (ulong)dmsBtLog_4);
                    }
                    else {
                      local_1460 = pBStack_610 + local_6b0;
                    }
                    pBStack_6c0 = local_1460;
                    if ((local_584 == 1) &&
                       (local_1450 - 1 < minMatch_5 - local_630 &&
                        2 < (dictEnd_4._4_4_ - 1) - local_6b0)) {
                      UVar24 = ZSTD_readMINMATCH(local_578,hashTable_4._4_4_);
                      UVar25 = ZSTD_readMINMATCH(pBStack_6c0,hashTable_4._4_4_);
                      if (UVar24 == UVar25) {
                        sVar36 = ZSTD_count_2segments
                                           (local_578 + hashTable_4._4_4_,
                                            pBStack_6c0 + hashTable_4._4_4_,local_580,prefixStart_5,
                                            _windowLow_4);
                        repMatch_4._4_4_ = (int)sVar36 + hashTable_4._4_4_;
                      }
                    }
                    if ((local_584 == 2) &&
                       (repLen_4 - 1 < minMatch_5 - (dmsHashLog_4 + dmsBtLog_4) &&
                        2 < (dictEnd_4._4_4_ - 1) - local_6b0)) {
                      UVar24 = ZSTD_readMINMATCH(local_578,hashTable_4._4_4_);
                      UVar25 = ZSTD_readMINMATCH(pBStack_6c0,hashTable_4._4_4_);
                      if (UVar24 == UVar25) {
                        sVar36 = ZSTD_count_2segments
                                           (local_578 + hashTable_4._4_4_,
                                            pBStack_6c0 + hashTable_4._4_4_,local_580,_dmsLowLimit_4
                                            ,_windowLow_4);
                        repMatch_4._4_4_ = (int)sVar36 + hashTable_4._4_4_;
                      }
                    }
                  }
                  if (_repCode_4 < (BYTE *)(ulong)repMatch_4._4_4_) {
                    _repCode_4 = (BYTE *)(ulong)repMatch_4._4_4_;
                    local_5a0[dms_4._4_4_].off = repIndex_4 - local_594;
                    local_5a0[dms_4._4_4_].len = repMatch_4._4_4_;
                    dms_4._4_4_ = dms_4._4_4_ + 1;
                    uVar30 = dms_4._4_4_;
                    if (base_7._4_4_ < repMatch_4._4_4_ || local_578 + repMatch_4._4_4_ == local_580
                       ) goto LAB_0013afc3;
                  }
                }
                if ((((uint)cParams_7 == 3) && (_repCode_4 < (BYTE *)0x3)) &&
                   (mlen_4._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_570,local_578),
                   smallerPtr_4._4_4_ <= mlen_4._4_4_ && minMatch_5 - mlen_4._4_4_ < 0x40000)) {
                  if (((local_584 == 0) || (local_584 == 2)) || (dictEnd_4._4_4_ <= mlen_4._4_4_)) {
                    match_17 = _hashLog_4 + mlen_4._4_4_;
                    match_16 = (BYTE *)ZSTD_count(local_578,match_17,local_580);
                  }
                  else {
                    nextPtr_8 = (U32 *)(pBStack_610 + mlen_4._4_4_);
                    match_16 = (BYTE *)ZSTD_count_2segments
                                                 (local_578,(BYTE *)nextPtr_8,local_580,
                                                  prefixStart_5,_windowLow_4);
                  }
                  if (match_16 < (BYTE *)(ulong)(uint)cParams_7) goto LAB_0013a8e1;
                  _repCode_4 = match_16;
                  local_5a0->off = (minMatch_5 - mlen_4._4_4_) + 2;
                  local_5a0->len = (U32)match_16;
                  dms_4._4_4_ = 1;
                  if (match_16 <= (BYTE *)(ulong)base_7._4_4_ &&
                      local_578 + (long)match_16 != local_580) goto LAB_0013a8e1;
                  local_570->nextToUpdate = minMatch_5 + 1;
                  local_564 = 1;
                  uVar30 = local_564;
                }
                else {
LAB_0013a8e1:
                  *(U32 *)(h_4 + sStack_5e0 * 4) = minMatch_5;
                  while (iVar29 = (int)dms_4 + -1, bVar39 = (int)dms_4 != 0, dms_4._0_4_ = iVar29,
                        bVar39 && smallerPtr_4._4_4_ <= bt_4._4_4_) {
                    matchLength_8 =
                         (size_t)(_btMask_4 + ((bt_4._4_4_ & (uint)commonLengthSmaller_4) << 1));
                    if (commonLengthLarger_4 < dictBase_4) {
                      local_1478 = (BYTE *)commonLengthLarger_4;
                    }
                    else {
                      local_1478 = dictBase_4;
                    }
                    match_18 = local_1478;
                    if (((local_584 == 0) || (local_584 == 2)) ||
                       ((BYTE *)(ulong)dictEnd_4._4_4_ <= local_1478 + bt_4._4_4_)) {
                      dmsH_4 = (size_t)(_hashLog_4 + bt_4._4_4_);
                      sVar36 = ZSTD_count(local_578 + (long)local_1478,
                                          (BYTE *)(dmsH_4 + (long)local_1478),local_580);
                      match_18 = match_18 + sVar36;
                    }
                    else {
                      dmsH_4 = (size_t)(pBStack_610 + bt_4._4_4_);
                      sVar36 = ZSTD_count_2segments
                                         (local_578 + (long)local_1478,
                                          (BYTE *)(dmsH_4 + (long)local_1478),local_580,
                                          prefixStart_5,_windowLow_4);
                      match_18 = match_18 + sVar36;
                      if ((BYTE *)(ulong)dictEnd_4._4_4_ <= match_18 + bt_4._4_4_) {
                        dmsH_4 = (size_t)(_hashLog_4 + bt_4._4_4_);
                      }
                    }
                    if (_repCode_4 < match_18) {
                      if ((BYTE *)(ulong)(mnum_4 - bt_4._4_4_) < match_18) {
                        mnum_4 = bt_4._4_4_ + (U32)match_18;
                      }
                      _repCode_4 = match_18;
                      local_5a0[dms_4._4_4_].off = (minMatch_5 - bt_4._4_4_) + 2;
                      local_5a0[dms_4._4_4_].len = (U32)match_18;
                      dms_4._4_4_ = dms_4._4_4_ + 1;
                      if ((BYTE *)0x1000 < match_18 || local_578 + (long)match_18 == local_580) {
                        if (local_584 == 2) {
                          dms_4._0_4_ = 0;
                        }
                        break;
                      }
                    }
                    if (match_18[dmsH_4] < local_578[(long)match_18]) {
                      *largerPtr_4 = bt_4._4_4_;
                      commonLengthLarger_4 = (size_t)match_18;
                      if (bt_4._4_4_ <= matchLow_4) {
                        largerPtr_4 = &nbCompares_4;
                        break;
                      }
                      largerPtr_4 = (U32 *)(matchLength_8 + 4);
                      bt_4._4_4_ = *(uint *)(matchLength_8 + 4);
                    }
                    else {
                      *_dummy32_4 = bt_4._4_4_;
                      dictBase_4 = match_18;
                      if (bt_4._4_4_ <= matchLow_4) {
                        _dummy32_4 = &nbCompares_4;
                        break;
                      }
                      _dummy32_4 = (U32 *)matchLength_8;
                      bt_4._4_4_ = *(uint *)matchLength_8;
                    }
                  }
                  *_dummy32_4 = 0;
                  *largerPtr_4 = 0;
                  if ((local_584 == 2) && ((int)dms_4 != 0)) {
                    sStack_700 = ZSTD_hashPtr(local_578,dmsBtMask_4,(uint)cParams_7);
                    dmsBt_4._4_4_ =
                         *(uint *)(*(long *)&dmsCParams_4[1].targetLength + sStack_700 * 4);
                    nextPtr_9 = *(U32 **)&dmsCParams_4[2].hashLog;
                    dictBase_4 = (BYTE *)0x0;
                    commonLengthLarger_4 = 0;
                    while (iVar29 = (int)dms_4 + -1, bVar39 = (int)dms_4 != 0, dms_4._0_4_ = iVar29,
                          bVar39 && dmsHashLog_4 < dmsBt_4._4_4_) {
                      matchLength_9 = (size_t)(nextPtr_9 + ((dmsBt_4._4_4_ & local_690) << 1));
                      if (commonLengthLarger_4 < dictBase_4) {
                        local_1488 = (BYTE *)commonLengthLarger_4;
                      }
                      else {
                        local_1488 = dictBase_4;
                      }
                      match_19 = local_1488;
                      local_728 = dmsEnd_4 + dmsBt_4._4_4_;
                      sVar36 = ZSTD_count_2segments
                                         (local_578 + (long)local_1488,local_728 + (long)local_1488,
                                          local_580,_dmsLowLimit_4,_windowLow_4);
                      match_19 = match_19 + sVar36;
                      if ((BYTE *)(ulong)dmsIndexDelta_4 <= match_19 + dmsBt_4._4_4_) {
                        local_728 = _hashLog_4 + (ulong)dmsBtLog_4 + (ulong)dmsBt_4._4_4_;
                      }
                      if (_repCode_4 < match_19) {
                        bt_4._4_4_ = dmsBt_4._4_4_ + dmsBtLog_4;
                        if ((BYTE *)(ulong)(mnum_4 - bt_4._4_4_) < match_19) {
                          mnum_4 = bt_4._4_4_ + (U32)match_19;
                        }
                        local_5a0[dms_4._4_4_].off = (minMatch_5 - bt_4._4_4_) + 2;
                        local_5a0[dms_4._4_4_].len = (U32)match_19;
                        dms_4._4_4_ = dms_4._4_4_ + 1;
                        _repCode_4 = match_19;
                        if ((BYTE *)0x1000 < match_19 || local_578 + (long)match_19 == local_580)
                        break;
                      }
                      if (dmsBt_4._4_4_ <= bestLength_4._4_4_) break;
                      if (local_728[(long)match_19] < local_578[(long)match_19]) {
                        dmsBt_4._4_4_ = *(uint *)(matchLength_9 + 4);
                        commonLengthLarger_4 = (size_t)match_19;
                      }
                      else {
                        dmsBt_4._4_4_ = *(uint *)matchLength_9;
                        dictBase_4 = match_19;
                      }
                    }
                  }
                  local_570->nextToUpdate = mnum_4 - 8;
                  local_564 = dms_4._4_4_;
                  uVar30 = local_564;
                }
LAB_0013afc3:
                local_564 = uVar30;
                local_f5c = local_564;
                dms_4._4_4_ = local_564;
                break;
              default:
                local_3bc = 0;
                cParams_8._0_4_ = 4;
                pZStack_3e8 = &ms->cParams;
                if ((ms->cParams).targetLength < 0xfff) {
                  local_148c = (ms->cParams).targetLength;
                }
                else {
                  local_148c = 0xfff;
                }
                base_8._4_4_ = local_148c;
                _hashLog_5 = (ms->window).base;
                minMatch_6 = iVar29 - (int)_hashLog_5;
                local_400 = (ms->cParams).hashLog;
                hashTable_5._4_4_ = 4;
                h_5 = (size_t)ms->hashTable;
                cParams_8._4_4_ = uVar21;
                local_3d8 = pZVar4;
                local_3cc = uVar31;
                local_3c8 = pUVar34;
                local_3b8 = iend_00;
                local_3b0 = pBVar35;
                local_3a8 = ms;
                sStack_418 = ZSTD_hashPtr(pBVar35,local_400,4);
                bt_5._4_4_ = *(uint *)(h_5 + sStack_418 * 4);
                _btMask_5 = local_3a8->chainTable;
                commonLengthSmaller_5._4_4_ = pZStack_3e8->chainLog - 1;
                commonLengthSmaller_5._0_4_ = (1 << ((byte)commonLengthSmaller_5._4_4_ & 0x1f)) - 1;
                commonLengthLarger_5 = 0;
                dictBase_5 = (BYTE *)0x0;
                pBStack_448 = (local_3a8->window).dictBase;
                dictEnd_5._4_4_ = (local_3a8->window).dictLimit;
                prefixStart_6 = pBStack_448 + dictEnd_5._4_4_;
                _windowLow_5 = _hashLog_5 + dictEnd_5._4_4_;
                if ((uint)commonLengthSmaller_5 < minMatch_6) {
                  local_1490 = minMatch_6 - (uint)commonLengthSmaller_5;
                }
                else {
                  local_1490 = 0;
                }
                matchLow_5 = local_1490;
                local_468 = (local_3a8->window).lowLimit;
                local_1494 = local_468;
                if (local_468 == 0) {
                  local_1494 = 1;
                }
                smallerPtr_5._4_4_ = local_1494;
                largerPtr_5 = _btMask_5 + ((minMatch_6 & (uint)commonLengthSmaller_5) << 1);
                _dummy32_5 = _btMask_5 +
                             (ulong)((minMatch_6 & (uint)commonLengthSmaller_5) << 1) + 1;
                mnum_5 = minMatch_6 + 9;
                dms_5._4_4_ = 0;
                dms_5._0_4_ = 1 << ((byte)pZStack_3e8->searchLog & 0x1f);
                if (local_3bc == 2) {
                  local_14a0 = local_3a8->dictMatchState;
                }
                else {
                  local_14a0 = (ZSTD_matchState_t *)0x0;
                }
                dmsCParams_5 = (ZSTD_compressionParameters *)local_14a0;
                if (local_3bc == 2) {
                  local_14a8 = &local_14a0->cParams;
                }
                else {
                  local_14a8 = (ZSTD_compressionParameters *)0x0;
                }
                dmsBase_5 = (BYTE *)local_14a8;
                if (local_3bc == 2) {
                  local_14b0 = (local_14a0->window).base;
                }
                else {
                  local_14b0 = (BYTE *)0x0;
                }
                dmsEnd_5 = local_14b0;
                if (local_3bc == 2) {
                  local_14b8 = (local_14a0->window).nextSrc;
                }
                else {
                  local_14b8 = (BYTE *)0x0;
                }
                _dmsLowLimit_5 = local_14b8;
                if (local_3bc == 2) {
                  local_14bc = (int)local_14b8 - (int)local_14b0;
                }
                else {
                  local_14bc = 0;
                }
                dmsIndexDelta_5 = local_14bc;
                if (local_3bc == 2) {
                  local_14c0 = (local_14a0->window).lowLimit;
                }
                else {
                  local_14c0 = 0;
                }
                dmsHashLog_5 = local_14c0;
                if (local_3bc == 2) {
                  local_14c4 = local_468 - local_14bc;
                }
                else {
                  local_14c4 = 0;
                }
                dmsBtLog_5 = local_14c4;
                if (local_3bc == 2) {
                  local_14c8 = local_14a8->hashLog;
                }
                else {
                  local_14c8 = local_400;
                }
                dmsBtMask_5 = local_14c8;
                local_14cc = commonLengthSmaller_5._4_4_;
                if (local_3bc == 2) {
                  local_14cc = local_14a8->chainLog - 1;
                }
                dmsBtLow_5 = local_14cc;
                if (local_3bc == 2) {
                  local_14d0 = (1 << ((byte)local_14cc & 0x1f)) - 1;
                }
                else {
                  local_14d0 = 0;
                }
                local_4c8 = local_14d0;
                if ((local_3bc == 2) && (local_14d0 < local_14bc - local_14c0)) {
                  local_14d4 = local_14bc - local_14d0;
                }
                else {
                  local_14d4 = local_14c0;
                }
                bestLength_5._4_4_ = local_14d4;
                _repCode_5 = (BYTE *)(ulong)(cParams_8._4_4_ - 1);
                repOffset_5 = local_3cc + 3;
                for (repIndex_5 = local_3cc; repIndex_5 < repOffset_5; repIndex_5 = repIndex_5 + 1)
                {
                  if (repIndex_5 == 3) {
                    local_14d8 = *local_3c8 - 1;
                  }
                  else {
                    local_14d8 = local_3c8[repIndex_5];
                  }
                  repLen_5 = local_14d8;
                  local_4e8 = minMatch_6 - local_14d8;
                  repMatch_5._4_4_ = 0;
                  if (local_14d8 - 1 < minMatch_6 - dictEnd_5._4_4_) {
                    UVar24 = ZSTD_readMINMATCH(local_3b0,hashTable_5._4_4_);
                    UVar25 = ZSTD_readMINMATCH(local_3b0 + -(ulong)repLen_5,hashTable_5._4_4_);
                    if (UVar24 == UVar25) {
                      sVar36 = ZSTD_count(local_3b0 + hashTable_5._4_4_,
                                          local_3b0 + ((ulong)hashTable_5._4_4_ - (ulong)repLen_5),
                                          local_3b8);
                      repMatch_5._4_4_ = (int)sVar36 + hashTable_5._4_4_;
                    }
                  }
                  else {
                    if (local_3bc == 2) {
                      local_14e8 = dmsEnd_5 + ((ulong)local_4e8 - (ulong)dmsBtLog_5);
                    }
                    else {
                      local_14e8 = pBStack_448 + local_4e8;
                    }
                    pBStack_4f8 = local_14e8;
                    if ((local_3bc == 1) &&
                       (local_14d8 - 1 < minMatch_6 - local_468 &&
                        2 < (dictEnd_5._4_4_ - 1) - local_4e8)) {
                      UVar24 = ZSTD_readMINMATCH(local_3b0,hashTable_5._4_4_);
                      UVar25 = ZSTD_readMINMATCH(pBStack_4f8,hashTable_5._4_4_);
                      if (UVar24 == UVar25) {
                        sVar36 = ZSTD_count_2segments
                                           (local_3b0 + hashTable_5._4_4_,
                                            pBStack_4f8 + hashTable_5._4_4_,local_3b8,prefixStart_6,
                                            _windowLow_5);
                        repMatch_5._4_4_ = (int)sVar36 + hashTable_5._4_4_;
                      }
                    }
                    if ((local_3bc == 2) &&
                       (repLen_5 - 1 < minMatch_6 - (dmsHashLog_5 + dmsBtLog_5) &&
                        2 < (dictEnd_5._4_4_ - 1) - local_4e8)) {
                      UVar24 = ZSTD_readMINMATCH(local_3b0,hashTable_5._4_4_);
                      UVar25 = ZSTD_readMINMATCH(pBStack_4f8,hashTable_5._4_4_);
                      if (UVar24 == UVar25) {
                        sVar36 = ZSTD_count_2segments
                                           (local_3b0 + hashTable_5._4_4_,
                                            pBStack_4f8 + hashTable_5._4_4_,local_3b8,_dmsLowLimit_5
                                            ,_windowLow_5);
                        repMatch_5._4_4_ = (int)sVar36 + hashTable_5._4_4_;
                      }
                    }
                  }
                  if (_repCode_5 < (BYTE *)(ulong)repMatch_5._4_4_) {
                    _repCode_5 = (BYTE *)(ulong)repMatch_5._4_4_;
                    local_3d8[dms_5._4_4_].off = repIndex_5 - local_3cc;
                    local_3d8[dms_5._4_4_].len = repMatch_5._4_4_;
                    dms_5._4_4_ = dms_5._4_4_ + 1;
                    uVar30 = dms_5._4_4_;
                    if (base_8._4_4_ < repMatch_5._4_4_ || local_3b0 + repMatch_5._4_4_ == local_3b8
                       ) goto LAB_0013c1ea;
                  }
                }
                if ((((uint)cParams_8 == 3) && (_repCode_5 < (BYTE *)0x3)) &&
                   (mlen_5._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_3a8,local_3b0),
                   smallerPtr_5._4_4_ <= mlen_5._4_4_ && minMatch_6 - mlen_5._4_4_ < 0x40000)) {
                  if (((local_3bc == 0) || (local_3bc == 2)) || (dictEnd_5._4_4_ <= mlen_5._4_4_)) {
                    match_21 = _hashLog_5 + mlen_5._4_4_;
                    match_20 = (BYTE *)ZSTD_count(local_3b0,match_21,local_3b8);
                  }
                  else {
                    nextPtr_10 = (U32 *)(pBStack_448 + mlen_5._4_4_);
                    match_20 = (BYTE *)ZSTD_count_2segments
                                                 (local_3b0,(BYTE *)nextPtr_10,local_3b8,
                                                  prefixStart_6,_windowLow_5);
                  }
                  if (match_20 < (BYTE *)(ulong)(uint)cParams_8) goto LAB_0013bb08;
                  _repCode_5 = match_20;
                  local_3d8->off = (minMatch_6 - mlen_5._4_4_) + 2;
                  local_3d8->len = (U32)match_20;
                  dms_5._4_4_ = 1;
                  if (match_20 <= (BYTE *)(ulong)base_8._4_4_ &&
                      local_3b0 + (long)match_20 != local_3b8) goto LAB_0013bb08;
                  local_3a8->nextToUpdate = minMatch_6 + 1;
                  local_39c = 1;
                  uVar30 = local_39c;
                }
                else {
LAB_0013bb08:
                  *(U32 *)(h_5 + sStack_418 * 4) = minMatch_6;
                  while (iVar29 = (int)dms_5 + -1, bVar39 = (int)dms_5 != 0, dms_5._0_4_ = iVar29,
                        bVar39 && smallerPtr_5._4_4_ <= bt_5._4_4_) {
                    matchLength_10 =
                         (size_t)(_btMask_5 + ((bt_5._4_4_ & (uint)commonLengthSmaller_5) << 1));
                    if (commonLengthLarger_5 < dictBase_5) {
                      local_1500 = (BYTE *)commonLengthLarger_5;
                    }
                    else {
                      local_1500 = dictBase_5;
                    }
                    match_22 = local_1500;
                    if (((local_3bc == 0) || (local_3bc == 2)) ||
                       ((BYTE *)(ulong)dictEnd_5._4_4_ <= local_1500 + bt_5._4_4_)) {
                      dmsH_5 = (size_t)(_hashLog_5 + bt_5._4_4_);
                      sVar36 = ZSTD_count(local_3b0 + (long)local_1500,
                                          (BYTE *)(dmsH_5 + (long)local_1500),local_3b8);
                      match_22 = match_22 + sVar36;
                    }
                    else {
                      dmsH_5 = (size_t)(pBStack_448 + bt_5._4_4_);
                      sVar36 = ZSTD_count_2segments
                                         (local_3b0 + (long)local_1500,
                                          (BYTE *)(dmsH_5 + (long)local_1500),local_3b8,
                                          prefixStart_6,_windowLow_5);
                      match_22 = match_22 + sVar36;
                      if ((BYTE *)(ulong)dictEnd_5._4_4_ <= match_22 + bt_5._4_4_) {
                        dmsH_5 = (size_t)(_hashLog_5 + bt_5._4_4_);
                      }
                    }
                    if (_repCode_5 < match_22) {
                      if ((BYTE *)(ulong)(mnum_5 - bt_5._4_4_) < match_22) {
                        mnum_5 = bt_5._4_4_ + (U32)match_22;
                      }
                      _repCode_5 = match_22;
                      local_3d8[dms_5._4_4_].off = (minMatch_6 - bt_5._4_4_) + 2;
                      local_3d8[dms_5._4_4_].len = (U32)match_22;
                      dms_5._4_4_ = dms_5._4_4_ + 1;
                      if ((BYTE *)0x1000 < match_22 || local_3b0 + (long)match_22 == local_3b8) {
                        if (local_3bc == 2) {
                          dms_5._0_4_ = 0;
                        }
                        break;
                      }
                    }
                    if (match_22[dmsH_5] < local_3b0[(long)match_22]) {
                      *largerPtr_5 = bt_5._4_4_;
                      commonLengthLarger_5 = (size_t)match_22;
                      if (bt_5._4_4_ <= matchLow_5) {
                        largerPtr_5 = &nbCompares_5;
                        break;
                      }
                      largerPtr_5 = (U32 *)(matchLength_10 + 4);
                      bt_5._4_4_ = *(uint *)(matchLength_10 + 4);
                    }
                    else {
                      *_dummy32_5 = bt_5._4_4_;
                      dictBase_5 = match_22;
                      if (bt_5._4_4_ <= matchLow_5) {
                        _dummy32_5 = &nbCompares_5;
                        break;
                      }
                      _dummy32_5 = (U32 *)matchLength_10;
                      bt_5._4_4_ = *(uint *)matchLength_10;
                    }
                  }
                  *_dummy32_5 = 0;
                  *largerPtr_5 = 0;
                  if ((local_3bc == 2) && ((int)dms_5 != 0)) {
                    sStack_538 = ZSTD_hashPtr(local_3b0,dmsBtMask_5,(uint)cParams_8);
                    dmsBt_5._4_4_ =
                         *(uint *)(*(long *)&dmsCParams_5[1].targetLength + sStack_538 * 4);
                    nextPtr_11 = *(U32 **)&dmsCParams_5[2].hashLog;
                    dictBase_5 = (BYTE *)0x0;
                    commonLengthLarger_5 = 0;
                    while (iVar29 = (int)dms_5 + -1, bVar39 = (int)dms_5 != 0, dms_5._0_4_ = iVar29,
                          bVar39 && dmsHashLog_5 < dmsBt_5._4_4_) {
                      matchLength_11 = (size_t)(nextPtr_11 + ((dmsBt_5._4_4_ & local_4c8) << 1));
                      if (commonLengthLarger_5 < dictBase_5) {
                        local_1510 = (BYTE *)commonLengthLarger_5;
                      }
                      else {
                        local_1510 = dictBase_5;
                      }
                      match_23 = local_1510;
                      local_560 = dmsEnd_5 + dmsBt_5._4_4_;
                      sVar36 = ZSTD_count_2segments
                                         (local_3b0 + (long)local_1510,local_560 + (long)local_1510,
                                          local_3b8,_dmsLowLimit_5,_windowLow_5);
                      match_23 = match_23 + sVar36;
                      if ((BYTE *)(ulong)dmsIndexDelta_5 <= match_23 + dmsBt_5._4_4_) {
                        local_560 = _hashLog_5 + (ulong)dmsBtLog_5 + (ulong)dmsBt_5._4_4_;
                      }
                      if (_repCode_5 < match_23) {
                        bt_5._4_4_ = dmsBt_5._4_4_ + dmsBtLog_5;
                        if ((BYTE *)(ulong)(mnum_5 - bt_5._4_4_) < match_23) {
                          mnum_5 = bt_5._4_4_ + (U32)match_23;
                        }
                        local_3d8[dms_5._4_4_].off = (minMatch_6 - bt_5._4_4_) + 2;
                        local_3d8[dms_5._4_4_].len = (U32)match_23;
                        dms_5._4_4_ = dms_5._4_4_ + 1;
                        _repCode_5 = match_23;
                        if ((BYTE *)0x1000 < match_23 || local_3b0 + (long)match_23 == local_3b8)
                        break;
                      }
                      if (dmsBt_5._4_4_ <= bestLength_5._4_4_) break;
                      if (local_560[(long)match_23] < local_3b0[(long)match_23]) {
                        dmsBt_5._4_4_ = *(uint *)(matchLength_11 + 4);
                        commonLengthLarger_5 = (size_t)match_23;
                      }
                      else {
                        dmsBt_5._4_4_ = *(uint *)matchLength_11;
                        dictBase_5 = match_23;
                      }
                    }
                  }
                  local_3a8->nextToUpdate = mnum_5 - 8;
                  local_39c = dms_5._4_4_;
                  uVar30 = local_39c;
                }
LAB_0013c1ea:
                local_39c = uVar30;
                local_f5c = local_39c;
                dms_5._4_4_ = local_39c;
                break;
              case 5:
                local_1f4 = 0;
                cParams_9._0_4_ = 5;
                pZStack_220 = &ms->cParams;
                if ((ms->cParams).targetLength < 0xfff) {
                  local_1514 = (ms->cParams).targetLength;
                }
                else {
                  local_1514 = 0xfff;
                }
                base_9._4_4_ = local_1514;
                _hashLog_6 = (ms->window).base;
                minMatch_7 = iVar29 - (int)_hashLog_6;
                local_238 = (ms->cParams).hashLog;
                hashTable_6._4_4_ = 4;
                h_6 = (size_t)ms->hashTable;
                cParams_9._4_4_ = uVar21;
                local_210 = pZVar4;
                local_204 = uVar31;
                local_200 = pUVar34;
                local_1f0 = iend_00;
                local_1e8 = pBVar35;
                local_1e0 = ms;
                sStack_250 = ZSTD_hashPtr(pBVar35,local_238,5);
                bt_6._4_4_ = *(uint *)(h_6 + sStack_250 * 4);
                _btMask_6 = local_1e0->chainTable;
                commonLengthSmaller_6._4_4_ = pZStack_220->chainLog - 1;
                commonLengthSmaller_6._0_4_ = (1 << ((byte)commonLengthSmaller_6._4_4_ & 0x1f)) - 1;
                commonLengthLarger_6 = 0;
                dictBase_6 = (BYTE *)0x0;
                pBStack_280 = (local_1e0->window).dictBase;
                dictEnd_6._4_4_ = (local_1e0->window).dictLimit;
                prefixStart_7 = pBStack_280 + dictEnd_6._4_4_;
                _windowLow_6 = _hashLog_6 + dictEnd_6._4_4_;
                if ((uint)commonLengthSmaller_6 < minMatch_7) {
                  local_1518 = minMatch_7 - (uint)commonLengthSmaller_6;
                }
                else {
                  local_1518 = 0;
                }
                matchLow_6 = local_1518;
                local_2a0 = (local_1e0->window).lowLimit;
                local_151c = local_2a0;
                if (local_2a0 == 0) {
                  local_151c = 1;
                }
                smallerPtr_6._4_4_ = local_151c;
                largerPtr_6 = _btMask_6 + ((minMatch_7 & (uint)commonLengthSmaller_6) << 1);
                _dummy32_6 = _btMask_6 +
                             (ulong)((minMatch_7 & (uint)commonLengthSmaller_6) << 1) + 1;
                mnum_6 = minMatch_7 + 9;
                dms_6._4_4_ = 0;
                dms_6._0_4_ = 1 << ((byte)pZStack_220->searchLog & 0x1f);
                if (local_1f4 == 2) {
                  local_1528 = local_1e0->dictMatchState;
                }
                else {
                  local_1528 = (ZSTD_matchState_t *)0x0;
                }
                dmsCParams_6 = (ZSTD_compressionParameters *)local_1528;
                if (local_1f4 == 2) {
                  local_1530 = &local_1528->cParams;
                }
                else {
                  local_1530 = (ZSTD_compressionParameters *)0x0;
                }
                dmsBase_6 = (BYTE *)local_1530;
                if (local_1f4 == 2) {
                  local_1538 = (local_1528->window).base;
                }
                else {
                  local_1538 = (BYTE *)0x0;
                }
                dmsEnd_6 = local_1538;
                if (local_1f4 == 2) {
                  local_1540 = (local_1528->window).nextSrc;
                }
                else {
                  local_1540 = (BYTE *)0x0;
                }
                _dmsLowLimit_6 = local_1540;
                if (local_1f4 == 2) {
                  local_1544 = (int)local_1540 - (int)local_1538;
                }
                else {
                  local_1544 = 0;
                }
                dmsIndexDelta_6 = local_1544;
                if (local_1f4 == 2) {
                  local_1548 = (local_1528->window).lowLimit;
                }
                else {
                  local_1548 = 0;
                }
                dmsHashLog_6 = local_1548;
                if (local_1f4 == 2) {
                  local_154c = local_2a0 - local_1544;
                }
                else {
                  local_154c = 0;
                }
                dmsBtLog_6 = local_154c;
                if (local_1f4 == 2) {
                  local_1550 = local_1530->hashLog;
                }
                else {
                  local_1550 = local_238;
                }
                dmsBtMask_6 = local_1550;
                local_1554 = commonLengthSmaller_6._4_4_;
                if (local_1f4 == 2) {
                  local_1554 = local_1530->chainLog - 1;
                }
                dmsBtLow_6 = local_1554;
                if (local_1f4 == 2) {
                  local_1558 = (1 << ((byte)local_1554 & 0x1f)) - 1;
                }
                else {
                  local_1558 = 0;
                }
                local_300 = local_1558;
                if ((local_1f4 == 2) && (local_1558 < local_1544 - local_1548)) {
                  local_155c = local_1544 - local_1558;
                }
                else {
                  local_155c = local_1548;
                }
                bestLength_6._4_4_ = local_155c;
                _repCode_6 = (BYTE *)(ulong)(cParams_9._4_4_ - 1);
                repOffset_6 = local_204 + 3;
                for (repIndex_6 = local_204; repIndex_6 < repOffset_6; repIndex_6 = repIndex_6 + 1)
                {
                  if (repIndex_6 == 3) {
                    local_1560 = *local_200 - 1;
                  }
                  else {
                    local_1560 = local_200[repIndex_6];
                  }
                  repLen_6 = local_1560;
                  local_320 = minMatch_7 - local_1560;
                  repMatch_6._4_4_ = 0;
                  if (local_1560 - 1 < minMatch_7 - dictEnd_6._4_4_) {
                    UVar24 = ZSTD_readMINMATCH(local_1e8,hashTable_6._4_4_);
                    UVar25 = ZSTD_readMINMATCH(local_1e8 + -(ulong)repLen_6,hashTable_6._4_4_);
                    if (UVar24 == UVar25) {
                      sVar36 = ZSTD_count(local_1e8 + hashTable_6._4_4_,
                                          local_1e8 + ((ulong)hashTable_6._4_4_ - (ulong)repLen_6),
                                          local_1f0);
                      repMatch_6._4_4_ = (int)sVar36 + hashTable_6._4_4_;
                    }
                  }
                  else {
                    if (local_1f4 == 2) {
                      local_1570 = dmsEnd_6 + ((ulong)local_320 - (ulong)dmsBtLog_6);
                    }
                    else {
                      local_1570 = pBStack_280 + local_320;
                    }
                    pBStack_330 = local_1570;
                    if ((local_1f4 == 1) &&
                       (local_1560 - 1 < minMatch_7 - local_2a0 &&
                        2 < (dictEnd_6._4_4_ - 1) - local_320)) {
                      UVar24 = ZSTD_readMINMATCH(local_1e8,hashTable_6._4_4_);
                      UVar25 = ZSTD_readMINMATCH(pBStack_330,hashTable_6._4_4_);
                      if (UVar24 == UVar25) {
                        sVar36 = ZSTD_count_2segments
                                           (local_1e8 + hashTable_6._4_4_,
                                            pBStack_330 + hashTable_6._4_4_,local_1f0,prefixStart_7,
                                            _windowLow_6);
                        repMatch_6._4_4_ = (int)sVar36 + hashTable_6._4_4_;
                      }
                    }
                    if ((local_1f4 == 2) &&
                       (repLen_6 - 1 < minMatch_7 - (dmsHashLog_6 + dmsBtLog_6) &&
                        2 < (dictEnd_6._4_4_ - 1) - local_320)) {
                      UVar24 = ZSTD_readMINMATCH(local_1e8,hashTable_6._4_4_);
                      UVar25 = ZSTD_readMINMATCH(pBStack_330,hashTable_6._4_4_);
                      if (UVar24 == UVar25) {
                        sVar36 = ZSTD_count_2segments
                                           (local_1e8 + hashTable_6._4_4_,
                                            pBStack_330 + hashTable_6._4_4_,local_1f0,_dmsLowLimit_6
                                            ,_windowLow_6);
                        repMatch_6._4_4_ = (int)sVar36 + hashTable_6._4_4_;
                      }
                    }
                  }
                  if (_repCode_6 < (BYTE *)(ulong)repMatch_6._4_4_) {
                    _repCode_6 = (BYTE *)(ulong)repMatch_6._4_4_;
                    local_210[dms_6._4_4_].off = repIndex_6 - local_204;
                    local_210[dms_6._4_4_].len = repMatch_6._4_4_;
                    dms_6._4_4_ = dms_6._4_4_ + 1;
                    uVar30 = dms_6._4_4_;
                    if (base_9._4_4_ < repMatch_6._4_4_ || local_1e8 + repMatch_6._4_4_ == local_1f0
                       ) goto LAB_0013d40f;
                  }
                }
                if ((((uint)cParams_9 == 3) && (_repCode_6 < (BYTE *)0x3)) &&
                   (mlen_6._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_1e0,local_1e8),
                   smallerPtr_6._4_4_ <= mlen_6._4_4_ && minMatch_7 - mlen_6._4_4_ < 0x40000)) {
                  if (((local_1f4 == 0) || (local_1f4 == 2)) || (dictEnd_6._4_4_ <= mlen_6._4_4_)) {
                    match_25 = _hashLog_6 + mlen_6._4_4_;
                    match_24 = (BYTE *)ZSTD_count(local_1e8,match_25,local_1f0);
                  }
                  else {
                    nextPtr_12 = (U32 *)(pBStack_280 + mlen_6._4_4_);
                    match_24 = (BYTE *)ZSTD_count_2segments
                                                 (local_1e8,(BYTE *)nextPtr_12,local_1f0,
                                                  prefixStart_7,_windowLow_6);
                  }
                  if (match_24 < (BYTE *)(ulong)(uint)cParams_9) goto LAB_0013cd2d;
                  _repCode_6 = match_24;
                  local_210->off = (minMatch_7 - mlen_6._4_4_) + 2;
                  local_210->len = (U32)match_24;
                  dms_6._4_4_ = 1;
                  if (match_24 <= (BYTE *)(ulong)base_9._4_4_ &&
                      local_1e8 + (long)match_24 != local_1f0) goto LAB_0013cd2d;
                  local_1e0->nextToUpdate = minMatch_7 + 1;
                  local_1d4 = 1;
                  uVar30 = local_1d4;
                }
                else {
LAB_0013cd2d:
                  *(U32 *)(h_6 + sStack_250 * 4) = minMatch_7;
                  while (iVar29 = (int)dms_6 + -1, bVar39 = (int)dms_6 != 0, dms_6._0_4_ = iVar29,
                        bVar39 && smallerPtr_6._4_4_ <= bt_6._4_4_) {
                    matchLength_12 =
                         (size_t)(_btMask_6 + ((bt_6._4_4_ & (uint)commonLengthSmaller_6) << 1));
                    if (commonLengthLarger_6 < dictBase_6) {
                      local_1588 = (BYTE *)commonLengthLarger_6;
                    }
                    else {
                      local_1588 = dictBase_6;
                    }
                    match_26 = local_1588;
                    if (((local_1f4 == 0) || (local_1f4 == 2)) ||
                       ((BYTE *)(ulong)dictEnd_6._4_4_ <= local_1588 + bt_6._4_4_)) {
                      dmsH_6 = (size_t)(_hashLog_6 + bt_6._4_4_);
                      sVar36 = ZSTD_count(local_1e8 + (long)local_1588,
                                          (BYTE *)(dmsH_6 + (long)local_1588),local_1f0);
                      match_26 = match_26 + sVar36;
                    }
                    else {
                      dmsH_6 = (size_t)(pBStack_280 + bt_6._4_4_);
                      sVar36 = ZSTD_count_2segments
                                         (local_1e8 + (long)local_1588,
                                          (BYTE *)(dmsH_6 + (long)local_1588),local_1f0,
                                          prefixStart_7,_windowLow_6);
                      match_26 = match_26 + sVar36;
                      if ((BYTE *)(ulong)dictEnd_6._4_4_ <= match_26 + bt_6._4_4_) {
                        dmsH_6 = (size_t)(_hashLog_6 + bt_6._4_4_);
                      }
                    }
                    if (_repCode_6 < match_26) {
                      if ((BYTE *)(ulong)(mnum_6 - bt_6._4_4_) < match_26) {
                        mnum_6 = bt_6._4_4_ + (U32)match_26;
                      }
                      _repCode_6 = match_26;
                      local_210[dms_6._4_4_].off = (minMatch_7 - bt_6._4_4_) + 2;
                      local_210[dms_6._4_4_].len = (U32)match_26;
                      dms_6._4_4_ = dms_6._4_4_ + 1;
                      if ((BYTE *)0x1000 < match_26 || local_1e8 + (long)match_26 == local_1f0) {
                        if (local_1f4 == 2) {
                          dms_6._0_4_ = 0;
                        }
                        break;
                      }
                    }
                    if (match_26[dmsH_6] < local_1e8[(long)match_26]) {
                      *largerPtr_6 = bt_6._4_4_;
                      commonLengthLarger_6 = (size_t)match_26;
                      if (bt_6._4_4_ <= matchLow_6) {
                        largerPtr_6 = &nbCompares_6;
                        break;
                      }
                      largerPtr_6 = (U32 *)(matchLength_12 + 4);
                      bt_6._4_4_ = *(uint *)(matchLength_12 + 4);
                    }
                    else {
                      *_dummy32_6 = bt_6._4_4_;
                      dictBase_6 = match_26;
                      if (bt_6._4_4_ <= matchLow_6) {
                        _dummy32_6 = &nbCompares_6;
                        break;
                      }
                      _dummy32_6 = (U32 *)matchLength_12;
                      bt_6._4_4_ = *(uint *)matchLength_12;
                    }
                  }
                  *_dummy32_6 = 0;
                  *largerPtr_6 = 0;
                  if ((local_1f4 == 2) && ((int)dms_6 != 0)) {
                    sStack_370 = ZSTD_hashPtr(local_1e8,dmsBtMask_6,(uint)cParams_9);
                    dmsBt_6._4_4_ =
                         *(uint *)(*(long *)&dmsCParams_6[1].targetLength + sStack_370 * 4);
                    nextPtr_13 = *(U32 **)&dmsCParams_6[2].hashLog;
                    dictBase_6 = (BYTE *)0x0;
                    commonLengthLarger_6 = 0;
                    while (iVar29 = (int)dms_6 + -1, bVar39 = (int)dms_6 != 0, dms_6._0_4_ = iVar29,
                          bVar39 && dmsHashLog_6 < dmsBt_6._4_4_) {
                      matchLength_13 = (size_t)(nextPtr_13 + ((dmsBt_6._4_4_ & local_300) << 1));
                      if (commonLengthLarger_6 < dictBase_6) {
                        local_1598 = (BYTE *)commonLengthLarger_6;
                      }
                      else {
                        local_1598 = dictBase_6;
                      }
                      match_27 = local_1598;
                      local_398 = dmsEnd_6 + dmsBt_6._4_4_;
                      sVar36 = ZSTD_count_2segments
                                         (local_1e8 + (long)local_1598,local_398 + (long)local_1598,
                                          local_1f0,_dmsLowLimit_6,_windowLow_6);
                      match_27 = match_27 + sVar36;
                      if ((BYTE *)(ulong)dmsIndexDelta_6 <= match_27 + dmsBt_6._4_4_) {
                        local_398 = _hashLog_6 + (ulong)dmsBtLog_6 + (ulong)dmsBt_6._4_4_;
                      }
                      if (_repCode_6 < match_27) {
                        bt_6._4_4_ = dmsBt_6._4_4_ + dmsBtLog_6;
                        if ((BYTE *)(ulong)(mnum_6 - bt_6._4_4_) < match_27) {
                          mnum_6 = bt_6._4_4_ + (U32)match_27;
                        }
                        local_210[dms_6._4_4_].off = (minMatch_7 - bt_6._4_4_) + 2;
                        local_210[dms_6._4_4_].len = (U32)match_27;
                        dms_6._4_4_ = dms_6._4_4_ + 1;
                        _repCode_6 = match_27;
                        if ((BYTE *)0x1000 < match_27 || local_1e8 + (long)match_27 == local_1f0)
                        break;
                      }
                      if (dmsBt_6._4_4_ <= bestLength_6._4_4_) break;
                      if (local_398[(long)match_27] < local_1e8[(long)match_27]) {
                        dmsBt_6._4_4_ = *(uint *)(matchLength_13 + 4);
                        commonLengthLarger_6 = (size_t)match_27;
                      }
                      else {
                        dmsBt_6._4_4_ = *(uint *)matchLength_13;
                        dictBase_6 = match_27;
                      }
                    }
                  }
                  local_1e0->nextToUpdate = mnum_6 - 8;
                  local_1d4 = dms_6._4_4_;
                  uVar30 = local_1d4;
                }
LAB_0013d40f:
                local_1d4 = uVar30;
                local_f5c = local_1d4;
                dms_6._4_4_ = local_1d4;
                break;
              case 6:
              case 7:
                local_2c = 0;
                cParams_10._0_4_ = 6;
                pZStack_58 = &ms->cParams;
                if ((ms->cParams).targetLength < 0xfff) {
                  local_159c = (ms->cParams).targetLength;
                }
                else {
                  local_159c = 0xfff;
                }
                base_10._4_4_ = local_159c;
                _hashLog_7 = (ms->window).base;
                minMatch_8 = iVar29 - (int)_hashLog_7;
                local_70 = (ms->cParams).hashLog;
                hashTable_7._4_4_ = 4;
                h_7 = (size_t)ms->hashTable;
                cParams_10._4_4_ = uVar21;
                local_48 = pZVar4;
                local_3c = uVar31;
                local_38 = pUVar34;
                local_28 = iend_00;
                local_20 = pBVar35;
                local_18 = ms;
                sStack_88 = ZSTD_hashPtr(pBVar35,local_70,6);
                bt_7._4_4_ = *(uint *)(h_7 + sStack_88 * 4);
                _btMask_7 = local_18->chainTable;
                commonLengthSmaller_7._4_4_ = pZStack_58->chainLog - 1;
                commonLengthSmaller_7._0_4_ = (1 << ((byte)commonLengthSmaller_7._4_4_ & 0x1f)) - 1;
                commonLengthLarger_7 = 0;
                dictBase_7 = (BYTE *)0x0;
                pBStack_b8 = (local_18->window).dictBase;
                dictEnd_7._4_4_ = (local_18->window).dictLimit;
                prefixStart_8 = pBStack_b8 + dictEnd_7._4_4_;
                _windowLow_7 = _hashLog_7 + dictEnd_7._4_4_;
                if ((uint)commonLengthSmaller_7 < minMatch_8) {
                  local_15a0 = minMatch_8 - (uint)commonLengthSmaller_7;
                }
                else {
                  local_15a0 = 0;
                }
                matchLow_7 = local_15a0;
                local_d8 = (local_18->window).lowLimit;
                local_15a4 = local_d8;
                if (local_d8 == 0) {
                  local_15a4 = 1;
                }
                smallerPtr_7._4_4_ = local_15a4;
                largerPtr_7 = _btMask_7 + ((minMatch_8 & (uint)commonLengthSmaller_7) << 1);
                _dummy32_7 = _btMask_7 +
                             (ulong)((minMatch_8 & (uint)commonLengthSmaller_7) << 1) + 1;
                mnum_7 = minMatch_8 + 9;
                dms_7._4_4_ = 0;
                dms_7._0_4_ = 1 << ((byte)pZStack_58->searchLog & 0x1f);
                if (local_2c == 2) {
                  local_15b0 = local_18->dictMatchState;
                }
                else {
                  local_15b0 = (ZSTD_matchState_t *)0x0;
                }
                dmsCParams_7 = (ZSTD_compressionParameters *)local_15b0;
                if (local_2c == 2) {
                  local_15b8 = &local_15b0->cParams;
                }
                else {
                  local_15b8 = (ZSTD_compressionParameters *)0x0;
                }
                dmsBase_7 = (BYTE *)local_15b8;
                if (local_2c == 2) {
                  local_15c0 = (local_15b0->window).base;
                }
                else {
                  local_15c0 = (BYTE *)0x0;
                }
                dmsEnd_7 = local_15c0;
                if (local_2c == 2) {
                  local_15c8 = (local_15b0->window).nextSrc;
                }
                else {
                  local_15c8 = (BYTE *)0x0;
                }
                _dmsLowLimit_7 = local_15c8;
                if (local_2c == 2) {
                  local_15cc = (int)local_15c8 - (int)local_15c0;
                }
                else {
                  local_15cc = 0;
                }
                dmsIndexDelta_7 = local_15cc;
                if (local_2c == 2) {
                  local_15d0 = (local_15b0->window).lowLimit;
                }
                else {
                  local_15d0 = 0;
                }
                dmsHashLog_7 = local_15d0;
                if (local_2c == 2) {
                  local_15d4 = local_d8 - local_15cc;
                }
                else {
                  local_15d4 = 0;
                }
                dmsBtLog_7 = local_15d4;
                if (local_2c == 2) {
                  local_15d8 = local_15b8->hashLog;
                }
                else {
                  local_15d8 = local_70;
                }
                dmsBtMask_7 = local_15d8;
                local_15dc = commonLengthSmaller_7._4_4_;
                if (local_2c == 2) {
                  local_15dc = local_15b8->chainLog - 1;
                }
                dmsBtLow_7 = local_15dc;
                if (local_2c == 2) {
                  local_15e0 = (1 << ((byte)local_15dc & 0x1f)) - 1;
                }
                else {
                  local_15e0 = 0;
                }
                local_138 = local_15e0;
                if ((local_2c == 2) && (local_15e0 < local_15cc - local_15d0)) {
                  local_15e4 = local_15cc - local_15e0;
                }
                else {
                  local_15e4 = local_15d0;
                }
                bestLength_7._4_4_ = local_15e4;
                _repCode_7 = (BYTE *)(ulong)(cParams_10._4_4_ - 1);
                repOffset_7 = local_3c + 3;
                for (repIndex_7 = local_3c; repIndex_7 < repOffset_7; repIndex_7 = repIndex_7 + 1) {
                  if (repIndex_7 == 3) {
                    local_15e8 = *local_38 - 1;
                  }
                  else {
                    local_15e8 = local_38[repIndex_7];
                  }
                  repLen_7 = local_15e8;
                  local_158 = minMatch_8 - local_15e8;
                  repMatch_7._4_4_ = 0;
                  if (local_15e8 - 1 < minMatch_8 - dictEnd_7._4_4_) {
                    UVar24 = ZSTD_readMINMATCH(local_20,hashTable_7._4_4_);
                    UVar25 = ZSTD_readMINMATCH(local_20 + -(ulong)repLen_7,hashTable_7._4_4_);
                    if (UVar24 == UVar25) {
                      sVar36 = ZSTD_count(local_20 + hashTable_7._4_4_,
                                          local_20 + ((ulong)hashTable_7._4_4_ - (ulong)repLen_7),
                                          local_28);
                      repMatch_7._4_4_ = (int)sVar36 + hashTable_7._4_4_;
                    }
                  }
                  else {
                    if (local_2c == 2) {
                      local_15f8 = dmsEnd_7 + ((ulong)local_158 - (ulong)dmsBtLog_7);
                    }
                    else {
                      local_15f8 = pBStack_b8 + local_158;
                    }
                    pBStack_168 = local_15f8;
                    if ((local_2c == 1) &&
                       (local_15e8 - 1 < minMatch_8 - local_d8 &&
                        2 < (dictEnd_7._4_4_ - 1) - local_158)) {
                      UVar24 = ZSTD_readMINMATCH(local_20,hashTable_7._4_4_);
                      UVar25 = ZSTD_readMINMATCH(pBStack_168,hashTable_7._4_4_);
                      if (UVar24 == UVar25) {
                        sVar36 = ZSTD_count_2segments
                                           (local_20 + hashTable_7._4_4_,
                                            pBStack_168 + hashTable_7._4_4_,local_28,prefixStart_8,
                                            _windowLow_7);
                        repMatch_7._4_4_ = (int)sVar36 + hashTable_7._4_4_;
                      }
                    }
                    if ((local_2c == 2) &&
                       (repLen_7 - 1 < minMatch_8 - (dmsHashLog_7 + dmsBtLog_7) &&
                        2 < (dictEnd_7._4_4_ - 1) - local_158)) {
                      UVar24 = ZSTD_readMINMATCH(local_20,hashTable_7._4_4_);
                      UVar25 = ZSTD_readMINMATCH(pBStack_168,hashTable_7._4_4_);
                      if (UVar24 == UVar25) {
                        sVar36 = ZSTD_count_2segments
                                           (local_20 + hashTable_7._4_4_,
                                            pBStack_168 + hashTable_7._4_4_,local_28,_dmsLowLimit_7,
                                            _windowLow_7);
                        repMatch_7._4_4_ = (int)sVar36 + hashTable_7._4_4_;
                      }
                    }
                  }
                  if (_repCode_7 < (BYTE *)(ulong)repMatch_7._4_4_) {
                    _repCode_7 = (BYTE *)(ulong)repMatch_7._4_4_;
                    local_48[dms_7._4_4_].off = repIndex_7 - local_3c;
                    local_48[dms_7._4_4_].len = repMatch_7._4_4_;
                    dms_7._4_4_ = dms_7._4_4_ + 1;
                    uVar30 = dms_7._4_4_;
                    if (base_10._4_4_ < repMatch_7._4_4_ || local_20 + repMatch_7._4_4_ == local_28)
                    goto LAB_0013e45f;
                  }
                }
                if ((((uint)cParams_10 == 3) && (_repCode_7 < (BYTE *)0x3)) &&
                   (mlen_7._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_18,local_20),
                   smallerPtr_7._4_4_ <= mlen_7._4_4_ && minMatch_8 - mlen_7._4_4_ < 0x40000)) {
                  if (((local_2c == 0) || (local_2c == 2)) || (dictEnd_7._4_4_ <= mlen_7._4_4_)) {
                    match_29 = _hashLog_7 + mlen_7._4_4_;
                    match_28 = (BYTE *)ZSTD_count(local_20,match_29,local_28);
                  }
                  else {
                    nextPtr_14 = (U32 *)(pBStack_b8 + mlen_7._4_4_);
                    match_28 = (BYTE *)ZSTD_count_2segments
                                                 (local_20,(BYTE *)nextPtr_14,local_28,prefixStart_8
                                                  ,_windowLow_7);
                  }
                  if (match_28 < (BYTE *)(ulong)(uint)cParams_10) goto LAB_0013dddd;
                  _repCode_7 = match_28;
                  local_48->off = (minMatch_8 - mlen_7._4_4_) + 2;
                  local_48->len = (U32)match_28;
                  dms_7._4_4_ = 1;
                  if (match_28 <= (BYTE *)(ulong)base_10._4_4_ &&
                      local_20 + (long)match_28 != local_28) goto LAB_0013dddd;
                  local_18->nextToUpdate = minMatch_8 + 1;
                  local_c = 1;
                  uVar30 = local_c;
                }
                else {
LAB_0013dddd:
                  *(U32 *)(h_7 + sStack_88 * 4) = minMatch_8;
                  while (iVar29 = (int)dms_7 + -1, bVar39 = (int)dms_7 != 0, dms_7._0_4_ = iVar29,
                        bVar39 && smallerPtr_7._4_4_ <= bt_7._4_4_) {
                    matchLength_14 =
                         (size_t)(_btMask_7 + ((bt_7._4_4_ & (uint)commonLengthSmaller_7) << 1));
                    if (commonLengthLarger_7 < dictBase_7) {
                      local_1610 = (BYTE *)commonLengthLarger_7;
                    }
                    else {
                      local_1610 = dictBase_7;
                    }
                    match_30 = local_1610;
                    if (((local_2c == 0) || (local_2c == 2)) ||
                       ((BYTE *)(ulong)dictEnd_7._4_4_ <= local_1610 + bt_7._4_4_)) {
                      dmsH_7 = (size_t)(_hashLog_7 + bt_7._4_4_);
                      sVar36 = ZSTD_count(local_20 + (long)local_1610,
                                          (BYTE *)(dmsH_7 + (long)local_1610),local_28);
                      match_30 = match_30 + sVar36;
                    }
                    else {
                      dmsH_7 = (size_t)(pBStack_b8 + bt_7._4_4_);
                      sVar36 = ZSTD_count_2segments
                                         (local_20 + (long)local_1610,
                                          (BYTE *)(dmsH_7 + (long)local_1610),local_28,prefixStart_8
                                          ,_windowLow_7);
                      match_30 = match_30 + sVar36;
                      if ((BYTE *)(ulong)dictEnd_7._4_4_ <= match_30 + bt_7._4_4_) {
                        dmsH_7 = (size_t)(_hashLog_7 + bt_7._4_4_);
                      }
                    }
                    if (_repCode_7 < match_30) {
                      if ((BYTE *)(ulong)(mnum_7 - bt_7._4_4_) < match_30) {
                        mnum_7 = bt_7._4_4_ + (U32)match_30;
                      }
                      _repCode_7 = match_30;
                      local_48[dms_7._4_4_].off = (minMatch_8 - bt_7._4_4_) + 2;
                      local_48[dms_7._4_4_].len = (U32)match_30;
                      dms_7._4_4_ = dms_7._4_4_ + 1;
                      if ((BYTE *)0x1000 < match_30 || local_20 + (long)match_30 == local_28) {
                        if (local_2c == 2) {
                          dms_7._0_4_ = 0;
                        }
                        break;
                      }
                    }
                    if (match_30[dmsH_7] < local_20[(long)match_30]) {
                      *largerPtr_7 = bt_7._4_4_;
                      commonLengthLarger_7 = (size_t)match_30;
                      if (bt_7._4_4_ <= matchLow_7) {
                        largerPtr_7 = &nbCompares_7;
                        break;
                      }
                      largerPtr_7 = (U32 *)(matchLength_14 + 4);
                      bt_7._4_4_ = *(uint *)(matchLength_14 + 4);
                    }
                    else {
                      *_dummy32_7 = bt_7._4_4_;
                      dictBase_7 = match_30;
                      if (bt_7._4_4_ <= matchLow_7) {
                        _dummy32_7 = &nbCompares_7;
                        break;
                      }
                      _dummy32_7 = (U32 *)matchLength_14;
                      bt_7._4_4_ = *(uint *)matchLength_14;
                    }
                  }
                  *_dummy32_7 = 0;
                  *largerPtr_7 = 0;
                  if ((local_2c == 2) && ((int)dms_7 != 0)) {
                    sStack_1a8 = ZSTD_hashPtr(local_20,dmsBtMask_7,(uint)cParams_10);
                    dmsBt_7._4_4_ =
                         *(uint *)(*(long *)&dmsCParams_7[1].targetLength + sStack_1a8 * 4);
                    nextPtr_15 = *(U32 **)&dmsCParams_7[2].hashLog;
                    dictBase_7 = (BYTE *)0x0;
                    commonLengthLarger_7 = 0;
                    while (iVar29 = (int)dms_7 + -1, bVar39 = (int)dms_7 != 0, dms_7._0_4_ = iVar29,
                          bVar39 && dmsHashLog_7 < dmsBt_7._4_4_) {
                      matchLength_15 = (size_t)(nextPtr_15 + ((dmsBt_7._4_4_ & local_138) << 1));
                      if (commonLengthLarger_7 < dictBase_7) {
                        local_1620 = (BYTE *)commonLengthLarger_7;
                      }
                      else {
                        local_1620 = dictBase_7;
                      }
                      match_31 = local_1620;
                      local_1d0 = dmsEnd_7 + dmsBt_7._4_4_;
                      sVar36 = ZSTD_count_2segments
                                         (local_20 + (long)local_1620,local_1d0 + (long)local_1620,
                                          local_28,_dmsLowLimit_7,_windowLow_7);
                      match_31 = match_31 + sVar36;
                      if ((BYTE *)(ulong)dmsIndexDelta_7 <= match_31 + dmsBt_7._4_4_) {
                        local_1d0 = _hashLog_7 + (ulong)dmsBtLog_7 + (ulong)dmsBt_7._4_4_;
                      }
                      if (_repCode_7 < match_31) {
                        bt_7._4_4_ = dmsBt_7._4_4_ + dmsBtLog_7;
                        if ((BYTE *)(ulong)(mnum_7 - bt_7._4_4_) < match_31) {
                          mnum_7 = bt_7._4_4_ + (U32)match_31;
                        }
                        local_48[dms_7._4_4_].off = (minMatch_8 - bt_7._4_4_) + 2;
                        local_48[dms_7._4_4_].len = (U32)match_31;
                        dms_7._4_4_ = dms_7._4_4_ + 1;
                        _repCode_7 = match_31;
                        if ((BYTE *)0x1000 < match_31 || local_20 + (long)match_31 == local_28)
                        break;
                      }
                      if (dmsBt_7._4_4_ <= bestLength_7._4_4_) break;
                      if (local_1d0[(long)match_31] < local_20[(long)match_31]) {
                        dmsBt_7._4_4_ = *(uint *)(matchLength_15 + 4);
                        commonLengthLarger_7 = (size_t)match_31;
                      }
                      else {
                        dmsBt_7._4_4_ = *(uint *)matchLength_15;
                        dictBase_7 = match_31;
                      }
                    }
                  }
                  local_18->nextToUpdate = mnum_7 - 8;
                  local_c = dms_7._4_4_;
                  uVar30 = local_c;
                }
LAB_0013e45f:
                local_c = uVar30;
                local_f5c = local_c;
                dms_7._4_4_ = local_c;
              }
            }
            if (local_f5c != 0) {
              lastSequence.price = pZVar4[local_f5c - 1].len;
              if ((local_1198 < (uint)lastSequence.price) || (0xfff < litlen + lastSequence.price))
              {
                _last_pos = CONCAT44(pZVar4[local_f5c - 1].off,last_pos);
                lastSequence.off = local_13f4;
                if (pZVar3[litlen].mlen == 0) {
                  local_1624 = pZVar3[litlen].litlen;
                }
                else {
                  local_1624 = 0;
                }
                litlen = litlen - local_1624;
                sol_00.mlen = lastSequence.mlen;
                sol_00.litlen = lastSequence.litlen;
                sol_00.price = lastSequence.price;
                sol_00.off = local_13f4;
                sol_00.rep[0] = lastSequence.rep[0];
                sol_00.rep[1] = (int)in_stack_ffffffffffffe994;
                sol_00.rep[2] = (int)((ulong)in_stack_ffffffffffffe994 >> 0x20);
                ZSTD_totalLen(sol_00);
                if (0x1000 < litlen) {
                  litlen = 0;
                }
                goto LAB_0013eb39;
              }
              for (offset_1 = 0; offset_1 < local_f5c; offset_1 = offset_1 + 1) {
                UVar24 = pZVar4[offset_1].off;
                rVar40 = ZSTD_updateRep(pZVar3[litlen].rep,UVar24,uVar31);
                _startML = rVar40.rep._0_8_;
                local_1100 = rVar40.rep[2];
                price_2 = pZVar4[offset_1].len;
                local_162c = uVar21;
                if (offset_1 != 0) {
                  local_162c = pZVar4[offset_1 - 1].len + 1;
                }
                for (; local_162c <= (uint)price_2; price_2 = price_2 + -1) {
                  uVar30 = litlen + price_2;
                  UVar25 = ZSTD_highbit32(UVar24 + 1);
                  if ((ms->opt).priceType == zop_predef) {
                    UVar26 = ZSTD_fracWeight(price_2 - 3U);
                    local_e4c = UVar26 + (UVar25 + 0x10) * 0x100;
                  }
                  else {
                    UVar26 = (ms->opt).offCodeSumBasePrice;
                    UVar27 = ZSTD_fracWeight((ms->opt).offCodeFreq[UVar25]);
                    UVar28 = ZSTD_MLcode(price_2 - 3U);
                    UVar1 = ML_bits[UVar28];
                    UVar2 = (ms->opt).matchLengthSumBasePrice;
                    UVar28 = ZSTD_fracWeight((ms->opt).matchLengthFreq[UVar28]);
                    local_e4c = UVar1 * 0x100 + (UVar2 - UVar28) +
                                UVar25 * 0x100 + (UVar26 - UVar27) + 0x33;
                  }
                  local_e4c = iVar23 + UVar32 + local_e4c;
                  if ((ll0 < uVar30) || (local_e4c < pZVar3[uVar30].price)) {
                    for (; ll0 < uVar30; ll0 = ll0 + 1) {
                      pZVar3[ll0 + 1].price = 0x40000000;
                    }
                    pZVar3[uVar30].mlen = price_2;
                    pZVar3[uVar30].off = UVar24;
                    pZVar3[uVar30].litlen = local_13f4;
                    pZVar3[uVar30].price = local_e4c;
                    *(undefined8 *)pZVar3[uVar30].rep = _startML;
                    pZVar3[uVar30].rep[2] = local_1100;
                  }
                }
              }
            }
          }
        }
        pZVar37 = pZVar3 + ll0;
        last_pos = pZVar37->price;
        cur = pZVar37->off;
        lastSequence.price = pZVar37->mlen;
        lastSequence.off = pZVar37->litlen;
        lastSequence.mlen = pZVar37->rep[0];
        lastSequence.litlen = pZVar37->rep[1];
        lastSequence.rep[0] = pZVar37->rep[2];
        uVar11 = pZVar37->mlen;
        uVar12 = pZVar37->litlen;
        uVar13 = pZVar37->rep[0];
        uVar14 = pZVar37->rep[1];
        uVar15 = pZVar37->rep[2];
        sol_02.rep[0] = uVar15;
        sol_02.litlen = uVar14;
        sol_02.mlen = uVar13;
        sol_02.off = uVar12;
        sol_02.price = uVar11;
        uVar6 = pZVar37->mlen;
        uVar7 = pZVar37->litlen;
        uVar8 = pZVar37->rep[0];
        uVar9 = pZVar37->rep[1];
        uVar10 = pZVar37->rep[2];
        sol_01.rep[0] = uVar10;
        sol_01.litlen = uVar9;
        sol_01.mlen = uVar8;
        sol_01.off = uVar7;
        sol_01.price = uVar6;
        sol_01.rep[1] = (int)in_stack_ffffffffffffe994;
        sol_01.rep[2] = (int)((ulong)in_stack_ffffffffffffe994 >> 0x20);
        UVar24 = ZSTD_totalLen(sol_01);
        if (UVar24 < ll0) {
          sol_02.rep[1] = (int)in_stack_ffffffffffffe994;
          sol_02.rep[2] = (int)((ulong)in_stack_ffffffffffffe994 >> 0x20);
          local_1654 = ZSTD_totalLen(sol_02);
          local_1654 = ll0 - local_1654;
        }
        else {
          local_1654 = 0;
        }
        litlen = local_1654;
      }
LAB_0013eb39:
      uVar31 = litlen + 1;
      local_1128 = litlen;
      pZVar37 = pZVar3 + uVar31;
      pZVar37->price = last_pos;
      pZVar37->off = cur;
      pZVar37->mlen = lastSequence.price;
      pZVar37->litlen = lastSequence.off;
      pZVar37->rep[0] = lastSequence.mlen;
      pZVar37->rep[1] = lastSequence.litlen;
      pZVar37->rep[2] = lastSequence.rep[0];
      backDist = uVar31;
      while (local_1128 != 0) {
        pZVar37 = pZVar3 + local_1128;
        uVar16 = pZVar37->mlen;
        uVar17 = pZVar37->litlen;
        uVar18 = pZVar37->rep[0];
        uVar19 = pZVar37->rep[1];
        uVar20 = pZVar37->rep[2];
        sol_03.rep[0] = uVar20;
        sol_03.litlen = uVar19;
        sol_03.mlen = uVar18;
        sol_03.off = uVar17;
        sol_03.price = uVar16;
        sol_03.rep[1] = (int)in_stack_ffffffffffffe994;
        sol_03.rep[2] = (int)((ulong)in_stack_ffffffffffffe994 >> 0x20);
        UVar32 = ZSTD_totalLen(sol_03);
        backDist = backDist - 1;
        pZVar37 = pZVar3 + backDist;
        pZVar38 = pZVar3 + local_1128;
        UVar24 = pZVar38->off;
        pZVar37->price = pZVar38->price;
        pZVar37->off = UVar24;
        UVar24 = pZVar38->litlen;
        pZVar37->mlen = pZVar38->mlen;
        pZVar37->litlen = UVar24;
        *(undefined8 *)pZVar37->rep = *(undefined8 *)pZVar38->rep;
        pZVar37->rep[2] = pZVar38->rep[2];
        if (UVar32 < local_1128) {
          local_165c = local_1128 - UVar32;
        }
        else {
          local_165c = 0;
        }
        local_1128 = local_165c;
      }
      for (mlen_9 = backDist; mlen_9 <= uVar31; mlen_9 = mlen_9 + 1) {
        uVar30 = pZVar3[mlen_9].litlen;
        UVar24 = pZVar3[mlen_9].mlen;
        uVar22 = pZVar3[mlen_9].off;
        if (UVar24 == 0) {
          anchor = iend + uVar30;
        }
        else {
          if (uVar22 < 3) {
            uVar33 = uVar22 + (uVar30 == 0);
            if (uVar33 != 0) {
              if (uVar33 == 3) {
                local_1660 = *rep - 1;
              }
              else {
                local_1660 = rep[uVar33];
              }
              if (1 < uVar33) {
                rep[2] = rep[1];
              }
              rep[1] = *rep;
              *rep = local_1660;
            }
          }
          else {
            rep[2] = rep[1];
            rep[1] = *rep;
            *rep = uVar22 - 2;
          }
          ZSTD_updateStats(optPtr,uVar30,iend,uVar22,UVar24);
          ZSTD_storeSeq(seqStore,(ulong)uVar30,iend,uVar22,(ulong)(UVar24 - 3));
          iend = iend + (uVar30 + UVar24);
          anchor = iend;
        }
      }
      ZSTD_setBasePrices(optPtr,2);
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const current = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (current == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}